

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void __thiscall
embree::avx512::CurveNiIntersectorK<8,8>::
intersect_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
          (CurveNiIntersectorK<8,8> *this,Precalculations *pre,RayHitK<8> *ray,size_t k,
          RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  Vector *pVVar5;
  float fVar6;
  undefined4 *puVar7;
  code *pcVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined8 uVar17;
  ulong uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [12];
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  byte bVar62;
  byte bVar63;
  byte bVar64;
  byte bVar65;
  ulong uVar66;
  ulong uVar67;
  byte bVar68;
  long lVar69;
  byte bVar70;
  int iVar71;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  bool bVar72;
  undefined1 uVar73;
  undefined1 uVar74;
  ulong uVar75;
  uint uVar76;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  uint uVar143;
  uint uVar144;
  uint uVar146;
  uint uVar147;
  uint uVar148;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  uint uVar145;
  uint uVar149;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float pp;
  float fVar150;
  undefined4 uVar151;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar164;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  float fVar165;
  float fVar166;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar206;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar233 [16];
  undefined1 auVar235 [16];
  undefined1 auVar234 [16];
  undefined1 auVar237 [32];
  undefined1 auVar236 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [64];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar246 [64];
  undefined1 auVar247 [32];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [16];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [32];
  undefined1 auVar259 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined1 *local_890;
  undefined8 local_888;
  undefined8 local_880;
  Precalculations *local_878;
  int *local_870;
  undefined4 local_868;
  undefined1 local_860 [32];
  undefined1 (*local_840) [32];
  RayQueryContext *local_838;
  ulong local_830;
  ulong local_828;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  undefined1 auStack_790 [16];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  float local_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined4 local_300;
  undefined4 uStack_2fc;
  undefined4 uStack_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  ulong uStack_140;
  int aiStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  
  bVar62 = *(byte *)((long)&context->scene + 1);
  uVar66 = (ulong)bVar62;
  fVar6 = *(float *)((long)context + uVar66 * 0x19 + 0x12);
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)((long)pre->ray_space + (long)ray * 4 + -0x20)),
                          ZEXT416((uint)pre->ray_space[0].vx.field_0.m128[(long)ray]),0x10);
  auVar79 = vinsertps_avx(auVar79,ZEXT416((uint)pre->ray_space[0].vz.field_0.m128[(long)ray]),0x20);
  auVar16 = vinsertps_avx(ZEXT416((uint)pre->ray_space[2].vx.field_0.m128[(long)ray]),
                          ZEXT416((uint)pre->ray_space[2].vz.field_0.m128[(long)ray]),0x10);
  auVar83 = vinsertps_avx(auVar16,ZEXT416((uint)pre->ray_space[3].vy.field_0.m128[(long)ray]),0x20);
  auVar84 = vsubps_avx(auVar79,*(undefined1 (*) [16])((long)context + uVar66 * 0x19 + 6));
  fVar206 = fVar6 * auVar84._0_4_;
  fVar150 = fVar6 * auVar83._0_4_;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)((long)&context->scene + uVar66 * 4 + 6);
  auVar98 = vpmovsxbd_avx2(auVar79);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)((long)&context->scene + uVar66 * 5 + 6);
  auVar96 = vpmovsxbd_avx2(auVar16);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)((long)&context->scene + uVar66 * 6 + 6);
  auVar97 = vpmovsxbd_avx2(auVar77);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)((long)&context->scene + uVar66 * 0xb + 6);
  auVar100 = vpmovsxbd_avx2(auVar80);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)((long)&context->scene + uVar66 * 0xc + 6);
  auVar101 = vpmovsxbd_avx2(auVar81);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)((long)&context->scene + uVar66 * 0xd + 6);
  auVar99 = vpmovsxbd_avx2(auVar82);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)((long)&context->scene + uVar66 * 0x12 + 6);
  auVar102 = vpmovsxbd_avx2(auVar89);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)((long)&context->scene + uVar66 * 0x13 + 6);
  auVar103 = vpmovsxbd_avx2(auVar78);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)((long)&context->scene + uVar66 * 0x14 + 6);
  auVar105 = vpmovsxbd_avx2(auVar88);
  auVar104 = vcvtdq2ps_avx(auVar105);
  auVar112._4_4_ = fVar150;
  auVar112._0_4_ = fVar150;
  auVar112._8_4_ = fVar150;
  auVar112._12_4_ = fVar150;
  auVar112._16_4_ = fVar150;
  auVar112._20_4_ = fVar150;
  auVar112._24_4_ = fVar150;
  auVar112._28_4_ = fVar150;
  auVar114._8_4_ = 1;
  auVar114._0_8_ = 0x100000001;
  auVar114._12_4_ = 1;
  auVar114._16_4_ = 1;
  auVar114._20_4_ = 1;
  auVar114._24_4_ = 1;
  auVar114._28_4_ = 1;
  auVar92 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar95 = ZEXT1632(CONCAT412(fVar6 * auVar83._12_4_,
                               CONCAT48(fVar6 * auVar83._8_4_,
                                        CONCAT44(fVar6 * auVar83._4_4_,fVar150))));
  auVar94 = vpermps_avx2(auVar114,auVar95);
  auVar93 = vpermps_avx512vl(auVar92,auVar95);
  fVar150 = auVar93._0_4_;
  auVar241._0_4_ = fVar150 * auVar97._0_4_;
  fVar165 = auVar93._4_4_;
  auVar241._4_4_ = fVar165 * auVar97._4_4_;
  fVar177 = auVar93._8_4_;
  auVar241._8_4_ = fVar177 * auVar97._8_4_;
  fVar179 = auVar93._12_4_;
  auVar241._12_4_ = fVar179 * auVar97._12_4_;
  fVar181 = auVar93._16_4_;
  auVar241._16_4_ = fVar181 * auVar97._16_4_;
  fVar164 = auVar93._20_4_;
  auVar241._20_4_ = fVar164 * auVar97._20_4_;
  fVar183 = auVar93._24_4_;
  auVar241._28_36_ = in_ZMM4._28_36_;
  auVar241._24_4_ = fVar183 * auVar97._24_4_;
  auVar95._4_4_ = auVar99._4_4_ * fVar165;
  auVar95._0_4_ = auVar99._0_4_ * fVar150;
  auVar95._8_4_ = auVar99._8_4_ * fVar177;
  auVar95._12_4_ = auVar99._12_4_ * fVar179;
  auVar95._16_4_ = auVar99._16_4_ * fVar181;
  auVar95._20_4_ = auVar99._20_4_ * fVar164;
  auVar95._24_4_ = auVar99._24_4_ * fVar183;
  auVar95._28_4_ = auVar105._28_4_;
  auVar105._4_4_ = auVar104._4_4_ * fVar165;
  auVar105._0_4_ = auVar104._0_4_ * fVar150;
  auVar105._8_4_ = auVar104._8_4_ * fVar177;
  auVar105._12_4_ = auVar104._12_4_ * fVar179;
  auVar105._16_4_ = auVar104._16_4_ * fVar181;
  auVar105._20_4_ = auVar104._20_4_ * fVar164;
  auVar105._24_4_ = auVar104._24_4_ * fVar183;
  auVar105._28_4_ = auVar93._28_4_;
  auVar79 = vfmadd231ps_fma(auVar241._0_32_,auVar94,auVar96);
  auVar16 = vfmadd231ps_fma(auVar95,auVar94,auVar101);
  auVar77 = vfmadd231ps_fma(auVar105,auVar103,auVar94);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar112,auVar98);
  auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar112,auVar100);
  auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar102,auVar112);
  auVar113._4_4_ = fVar206;
  auVar113._0_4_ = fVar206;
  auVar113._8_4_ = fVar206;
  auVar113._12_4_ = fVar206;
  auVar113._16_4_ = fVar206;
  auVar113._20_4_ = fVar206;
  auVar113._24_4_ = fVar206;
  auVar113._28_4_ = fVar206;
  auVar94 = ZEXT1632(CONCAT412(fVar6 * auVar84._12_4_,
                               CONCAT48(fVar6 * auVar84._8_4_,
                                        CONCAT44(fVar6 * auVar84._4_4_,fVar206))));
  auVar105 = vpermps_avx2(auVar114,auVar94);
  auVar94 = vpermps_avx512vl(auVar92,auVar94);
  auVar95 = vmulps_avx512vl(auVar94,auVar97);
  auVar107._0_4_ = auVar94._0_4_ * auVar99._0_4_;
  auVar107._4_4_ = auVar94._4_4_ * auVar99._4_4_;
  auVar107._8_4_ = auVar94._8_4_ * auVar99._8_4_;
  auVar107._12_4_ = auVar94._12_4_ * auVar99._12_4_;
  auVar107._16_4_ = auVar94._16_4_ * auVar99._16_4_;
  auVar107._20_4_ = auVar94._20_4_ * auVar99._20_4_;
  auVar107._24_4_ = auVar94._24_4_ * auVar99._24_4_;
  auVar107._28_4_ = 0;
  auVar99._4_4_ = auVar94._4_4_ * auVar104._4_4_;
  auVar99._0_4_ = auVar94._0_4_ * auVar104._0_4_;
  auVar99._8_4_ = auVar94._8_4_ * auVar104._8_4_;
  auVar99._12_4_ = auVar94._12_4_ * auVar104._12_4_;
  auVar99._16_4_ = auVar94._16_4_ * auVar104._16_4_;
  auVar99._20_4_ = auVar94._20_4_ * auVar104._20_4_;
  auVar99._24_4_ = auVar94._24_4_ * auVar104._24_4_;
  auVar99._28_4_ = auVar97._28_4_;
  auVar96 = vfmadd231ps_avx512vl(auVar95,auVar105,auVar96);
  auVar80 = vfmadd231ps_fma(auVar107,auVar105,auVar101);
  auVar81 = vfmadd231ps_fma(auVar99,auVar105,auVar103);
  auVar96 = vfmadd231ps_avx512vl(auVar96,auVar113,auVar98);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar113,auVar100);
  auVar111._8_4_ = 0x7fffffff;
  auVar111._0_8_ = 0x7fffffff7fffffff;
  auVar111._12_4_ = 0x7fffffff;
  auVar111._16_4_ = 0x7fffffff;
  auVar111._20_4_ = 0x7fffffff;
  auVar111._24_4_ = 0x7fffffff;
  auVar111._28_4_ = 0x7fffffff;
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar113,auVar102);
  auVar98 = vandps_avx(auVar111,ZEXT1632(auVar79));
  auVar109._8_4_ = 0x219392ef;
  auVar109._0_8_ = 0x219392ef219392ef;
  auVar109._12_4_ = 0x219392ef;
  auVar109._16_4_ = 0x219392ef;
  auVar109._20_4_ = 0x219392ef;
  auVar109._24_4_ = 0x219392ef;
  auVar109._28_4_ = 0x219392ef;
  uVar67 = vcmpps_avx512vl(auVar98,auVar109,1);
  bVar72 = (bool)((byte)uVar67 & 1);
  auVar94._0_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar79._0_4_;
  bVar72 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar79._4_4_;
  bVar72 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar79._8_4_;
  bVar72 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar79._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar67 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(auVar111,ZEXT1632(auVar16));
  uVar67 = vcmpps_avx512vl(auVar98,auVar109,1);
  bVar72 = (bool)((byte)uVar67 & 1);
  auVar92._0_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar16._0_4_;
  bVar72 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar16._4_4_;
  bVar72 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar16._8_4_;
  bVar72 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar16._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar67 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(auVar111,ZEXT1632(auVar77));
  uVar67 = vcmpps_avx512vl(auVar98,auVar109,1);
  bVar72 = (bool)((byte)uVar67 & 1);
  auVar98._0_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar77._0_4_;
  bVar72 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar77._4_4_;
  bVar72 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar77._8_4_;
  bVar72 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar77._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar67 >> 7) * 0x219392ef;
  auVar97 = vrcp14ps_avx512vl(auVar94);
  auVar110._8_4_ = 0x3f800000;
  auVar110._0_8_ = 0x3f8000003f800000;
  auVar110._12_4_ = 0x3f800000;
  auVar110._16_4_ = 0x3f800000;
  auVar110._20_4_ = 0x3f800000;
  auVar110._24_4_ = 0x3f800000;
  auVar110._28_4_ = 0x3f800000;
  auVar79 = vfnmadd213ps_fma(auVar94,auVar97,auVar110);
  auVar79 = vfmadd132ps_fma(ZEXT1632(auVar79),auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar92);
  auVar16 = vfnmadd213ps_fma(auVar92,auVar97,auVar110);
  auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar98);
  auVar77 = vfnmadd213ps_fma(auVar98,auVar97,auVar110);
  auVar77 = vfmadd132ps_fma(ZEXT1632(auVar77),auVar97,auVar97);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar66 * 7 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx512vl(auVar98,auVar96);
  auVar102._4_4_ = auVar79._4_4_ * auVar98._4_4_;
  auVar102._0_4_ = auVar79._0_4_ * auVar98._0_4_;
  auVar102._8_4_ = auVar79._8_4_ * auVar98._8_4_;
  auVar102._12_4_ = auVar79._12_4_ * auVar98._12_4_;
  auVar102._16_4_ = auVar98._16_4_ * 0.0;
  auVar102._20_4_ = auVar98._20_4_ * 0.0;
  auVar102._24_4_ = auVar98._24_4_ * 0.0;
  auVar102._28_4_ = auVar98._28_4_;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar66 * 9 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx512vl(auVar98,auVar96);
  auVar108._0_4_ = auVar79._0_4_ * auVar98._0_4_;
  auVar108._4_4_ = auVar79._4_4_ * auVar98._4_4_;
  auVar108._8_4_ = auVar79._8_4_ * auVar98._8_4_;
  auVar108._12_4_ = auVar79._12_4_ * auVar98._12_4_;
  auVar108._16_4_ = auVar98._16_4_ * 0.0;
  auVar108._20_4_ = auVar98._20_4_ * 0.0;
  auVar108._24_4_ = auVar98._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar66 * 0xe + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar80));
  auVar103._4_4_ = auVar16._4_4_ * auVar98._4_4_;
  auVar103._0_4_ = auVar16._0_4_ * auVar98._0_4_;
  auVar103._8_4_ = auVar16._8_4_ * auVar98._8_4_;
  auVar103._12_4_ = auVar16._12_4_ * auVar98._12_4_;
  auVar103._16_4_ = auVar98._16_4_ * 0.0;
  auVar103._20_4_ = auVar98._20_4_ * 0.0;
  auVar103._24_4_ = auVar98._24_4_ * 0.0;
  auVar103._28_4_ = auVar98._28_4_;
  auVar99 = vpbroadcastd_avx512vl();
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + (ulong)bVar62 * 0x10 + 6))
  ;
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar80));
  auVar106._0_4_ = auVar16._0_4_ * auVar98._0_4_;
  auVar106._4_4_ = auVar16._4_4_ * auVar98._4_4_;
  auVar106._8_4_ = auVar16._8_4_ * auVar98._8_4_;
  auVar106._12_4_ = auVar16._12_4_ * auVar98._12_4_;
  auVar106._16_4_ = auVar98._16_4_ * 0.0;
  auVar106._20_4_ = auVar98._20_4_ * 0.0;
  auVar106._24_4_ = auVar98._24_4_ * 0.0;
  auVar106._28_4_ = 0;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar66 * 0x15 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar81));
  auVar104._4_4_ = auVar98._4_4_ * auVar77._4_4_;
  auVar104._0_4_ = auVar98._0_4_ * auVar77._0_4_;
  auVar104._8_4_ = auVar98._8_4_ * auVar77._8_4_;
  auVar104._12_4_ = auVar98._12_4_ * auVar77._12_4_;
  auVar104._16_4_ = auVar98._16_4_ * 0.0;
  auVar104._20_4_ = auVar98._20_4_ * 0.0;
  auVar104._24_4_ = auVar98._24_4_ * 0.0;
  auVar104._28_4_ = auVar98._28_4_;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar66 * 0x17 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar81));
  auVar93._0_4_ = auVar77._0_4_ * auVar98._0_4_;
  auVar93._4_4_ = auVar77._4_4_ * auVar98._4_4_;
  auVar93._8_4_ = auVar77._8_4_ * auVar98._8_4_;
  auVar93._12_4_ = auVar77._12_4_ * auVar98._12_4_;
  auVar93._16_4_ = auVar98._16_4_ * 0.0;
  auVar93._20_4_ = auVar98._20_4_ * 0.0;
  auVar93._24_4_ = auVar98._24_4_ * 0.0;
  auVar93._28_4_ = 0;
  auVar98 = vpminsd_avx2(auVar102,auVar108);
  auVar96 = vpminsd_avx2(auVar103,auVar106);
  auVar98 = vmaxps_avx(auVar98,auVar96);
  auVar96 = vpminsd_avx2(auVar104,auVar93);
  uVar151 = *(undefined4 *)((long)&pre->ray_space[1].vy.field_0 + (long)ray * 4);
  auVar97._4_4_ = uVar151;
  auVar97._0_4_ = uVar151;
  auVar97._8_4_ = uVar151;
  auVar97._12_4_ = uVar151;
  auVar97._16_4_ = uVar151;
  auVar97._20_4_ = uVar151;
  auVar97._24_4_ = uVar151;
  auVar97._28_4_ = uVar151;
  auVar96 = vmaxps_avx512vl(auVar96,auVar97);
  auVar98 = vmaxps_avx(auVar98,auVar96);
  auVar96._8_4_ = 0x3f7ffffa;
  auVar96._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar96._12_4_ = 0x3f7ffffa;
  auVar96._16_4_ = 0x3f7ffffa;
  auVar96._20_4_ = 0x3f7ffffa;
  auVar96._24_4_ = 0x3f7ffffa;
  auVar96._28_4_ = 0x3f7ffffa;
  local_280 = vmulps_avx512vl(auVar98,auVar96);
  auVar98 = vpmaxsd_avx2(auVar102,auVar108);
  auVar96 = vpmaxsd_avx2(auVar103,auVar106);
  auVar241 = ZEXT3264(auVar111);
  auVar98 = vminps_avx(auVar98,auVar96);
  auVar96 = vpmaxsd_avx2(auVar104,auVar93);
  uVar151 = *(undefined4 *)((long)&pre->ray_space[4].vz.field_0 + (long)ray * 4);
  auVar100._4_4_ = uVar151;
  auVar100._0_4_ = uVar151;
  auVar100._8_4_ = uVar151;
  auVar100._12_4_ = uVar151;
  auVar100._16_4_ = uVar151;
  auVar100._20_4_ = uVar151;
  auVar100._24_4_ = uVar151;
  auVar100._28_4_ = uVar151;
  auVar96 = vminps_avx512vl(auVar96,auVar100);
  auVar98 = vminps_avx(auVar98,auVar96);
  auVar101._8_4_ = 0x3f800003;
  auVar101._0_8_ = 0x3f8000033f800003;
  auVar101._12_4_ = 0x3f800003;
  auVar101._16_4_ = 0x3f800003;
  auVar101._20_4_ = 0x3f800003;
  auVar101._24_4_ = 0x3f800003;
  auVar101._28_4_ = 0x3f800003;
  auVar98 = vmulps_avx512vl(auVar98,auVar101);
  uVar17 = vcmpps_avx512vl(local_280,auVar98,2);
  uVar20 = vpcmpgtd_avx512vl(auVar99,_DAT_01fb4ba0);
  local_830 = CONCAT44((int)((ulong)prim >> 0x20),(uint)(byte)((byte)uVar17 & (byte)uVar20));
  local_840 = &local_320;
  local_4a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)ray & 0x1f)));
  local_838 = context;
LAB_01a0dfbf:
  iVar71 = 1;
  if (local_830 == 0) {
    return;
  }
  lVar69 = 0;
  for (uVar67 = local_830; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
    lVar69 = lVar69 + 1;
  }
  fVar150 = *(float *)((long)&context->scene + 2);
  uVar66 = (ulong)(uint)fVar150;
  local_828 = (ulong)*(uint *)((long)&context->scene + lVar69 * 4 + 6);
  lVar69 = *(long *)(*(long *)(*(long *)k + 0x1e8) + uVar66 * 8);
  uVar67 = (ulong)*(uint *)(*(long *)(lVar69 + 0x58) + local_828 * *(long *)(lVar69 + 0x68));
  auVar79 = *(undefined1 (*) [16])(*(long *)(lVar69 + 0x90) + *(long *)(lVar69 + 0xa0) * uVar67);
  auVar16 = *(undefined1 (*) [16])
             (*(long *)(lVar69 + 0x90) + *(long *)(lVar69 + 0xa0) * (uVar67 + 1));
  auVar77 = vinsertps_avx(ZEXT416(*(uint *)((long)pre->ray_space + (long)ray * 4 + -0x20)),
                          ZEXT416((uint)pre->ray_space[0].vx.field_0.m128[(long)ray]),0x1c);
  auVar80 = vinsertps_avx(auVar77,ZEXT416((uint)pre->ray_space[0].vz.field_0.m128[(long)ray]),0x28);
  local_740 = vbroadcastss_avx512vl(ZEXT416((uint)pre->ray_space[2].vx.field_0.m128[(long)ray]));
  auVar256 = ZEXT3264(local_740);
  local_420 = vbroadcastss_avx512vl(ZEXT416((uint)pre->ray_space[2].vz.field_0.m128[(long)ray]));
  auVar77 = vunpcklps_avx512vl(local_740._0_16_,local_420._0_16_);
  local_760 = vbroadcastss_avx512vl(ZEXT416((uint)pre->ray_space[3].vy.field_0.m128[(long)ray]));
  auVar257 = ZEXT3264(local_760);
  auVar88 = local_760._0_16_;
  local_770 = vinsertps_avx512f(auVar77,auVar88,0x28);
  auVar84._8_4_ = 0xbeaaaaab;
  auVar84._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar84._12_4_ = 0xbeaaaaab;
  auVar82 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (*(long *)(lVar69 + 0x100) + uVar67 * *(long *)(lVar69 + 0x110)),
                             auVar79,auVar84);
  auVar81 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (*(long *)(lVar69 + 0x100) + *(long *)(lVar69 + 0x110) * (uVar67 + 1)),
                            auVar16,auVar84);
  auVar85._0_4_ = auVar16._0_4_ + auVar79._0_4_ + auVar82._0_4_ + auVar81._0_4_;
  auVar85._4_4_ = auVar16._4_4_ + auVar79._4_4_ + auVar82._4_4_ + auVar81._4_4_;
  auVar85._8_4_ = auVar16._8_4_ + auVar79._8_4_ + auVar82._8_4_ + auVar81._8_4_;
  auVar85._12_4_ = auVar16._12_4_ + auVar79._12_4_ + auVar82._12_4_ + auVar81._12_4_;
  auVar83._8_4_ = 0x3e800000;
  auVar83._0_8_ = 0x3e8000003e800000;
  auVar83._12_4_ = 0x3e800000;
  auVar77 = vmulps_avx512vl(auVar85,auVar83);
  auVar77 = vsubps_avx(auVar77,auVar80);
  auVar77 = vdpps_avx(auVar77,local_770,0x7f);
  local_780 = vdpps_avx(local_770,local_770,0x7f);
  fVar6 = pre->ray_space[1].vy.field_0.m128[(long)ray];
  auVar90._4_12_ = ZEXT812(0) << 0x20;
  auVar90._0_4_ = local_780._0_4_;
  auVar78 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar90);
  auVar89 = vfnmadd213ss_fma(auVar78,local_780,ZEXT416(0x40000000));
  local_260 = auVar77._0_4_ * auVar78._0_4_ * auVar89._0_4_;
  auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar259 = ZEXT3264(auVar98);
  auVar87._4_4_ = local_260;
  auVar87._0_4_ = local_260;
  auVar87._8_4_ = local_260;
  auVar87._12_4_ = local_260;
  fStack_710 = local_260;
  _local_720 = auVar87;
  fStack_70c = local_260;
  fStack_708 = local_260;
  fStack_704 = local_260;
  auVar77 = vfmadd231ps_fma(auVar80,local_770,auVar87);
  auVar77 = vblendps_avx(auVar77,ZEXT816(0) << 0x40,8);
  auVar79 = vsubps_avx(auVar79,auVar77);
  auVar80 = vsubps_avx(auVar81,auVar77);
  auVar81 = vsubps_avx(auVar82,auVar77);
  auVar16 = vsubps_avx(auVar16,auVar77);
  uVar151 = auVar79._0_4_;
  local_800._4_4_ = uVar151;
  local_800._0_4_ = uVar151;
  local_800._8_4_ = uVar151;
  local_800._12_4_ = uVar151;
  local_800._16_4_ = uVar151;
  local_800._20_4_ = uVar151;
  local_800._24_4_ = uVar151;
  local_800._28_4_ = uVar151;
  auVar249 = ZEXT3264(local_800);
  auVar115._8_4_ = 1;
  auVar115._0_8_ = 0x100000001;
  auVar115._12_4_ = 1;
  auVar115._16_4_ = 1;
  auVar115._20_4_ = 1;
  auVar115._24_4_ = 1;
  auVar115._28_4_ = 1;
  local_600 = ZEXT1632(auVar79);
  local_820 = vpermps_avx2(auVar115,local_600);
  auVar250 = ZEXT3264(local_820);
  auVar116._8_4_ = 2;
  auVar116._0_8_ = 0x200000002;
  auVar116._12_4_ = 2;
  auVar116._16_4_ = 2;
  auVar116._20_4_ = 2;
  auVar116._24_4_ = 2;
  auVar116._28_4_ = 2;
  local_7c0 = vpermps_avx2(auVar116,local_600);
  auVar117._8_4_ = 3;
  auVar117._0_8_ = 0x300000003;
  auVar117._12_4_ = 3;
  auVar117._16_4_ = 3;
  auVar117._20_4_ = 3;
  auVar117._24_4_ = 3;
  auVar117._28_4_ = 3;
  local_7e0 = vpermps_avx2(auVar117,local_600);
  auVar96 = vbroadcastss_avx512vl(auVar81);
  local_640 = ZEXT1632(auVar81);
  auVar98 = vpermps_avx2(auVar115,local_640);
  auVar97 = vpermps_avx512vl(auVar116,local_640);
  auVar100 = vpermps_avx512vl(auVar117,local_640);
  auVar101 = vbroadcastss_avx512vl(auVar80);
  local_620 = ZEXT1632(auVar80);
  auVar99 = vpermps_avx512vl(auVar115,local_620);
  auVar102 = vpermps_avx512vl(auVar116,local_620);
  auVar103 = vpermps_avx512vl(auVar117,local_620);
  auVar104 = vbroadcastss_avx512vl(auVar16);
  _local_660 = ZEXT1632(auVar16);
  auVar105 = vpermps_avx512vl(auVar115,_local_660);
  auVar94 = vpermps_avx512vl(auVar116,_local_660);
  auVar95 = vpermps_avx512vl(auVar117,_local_660);
  auVar246 = ZEXT3264(local_7c0);
  auVar79 = vmulss_avx512f(auVar88,auVar88);
  auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),local_420,local_420);
  auVar92 = vfmadd231ps_avx512vl(auVar92,local_740,local_740);
  uVar151 = auVar92._0_4_;
  local_220._4_4_ = uVar151;
  local_220._0_4_ = uVar151;
  local_220._8_4_ = uVar151;
  local_220._12_4_ = uVar151;
  local_220._16_4_ = uVar151;
  local_220._20_4_ = uVar151;
  local_220._24_4_ = uVar151;
  local_220._28_4_ = uVar151;
  local_240 = vandps_avx(auVar241._0_32_,local_220);
  auVar248 = ZEXT3264(local_7e0);
  local_6b0 = ZEXT416((uint)local_260);
  local_260 = fVar6 - local_260;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_440 = vpbroadcastd_avx512vl();
  uVar67 = 0;
  local_460 = vpbroadcastd_avx512vl();
  auVar79 = vsqrtss_avx(local_780,local_780);
  auVar16 = vsqrtss_avx(local_780,local_780);
  local_4b0 = ZEXT816(0x3f80000000000000);
  do {
    auVar77 = vmovshdup_avx(local_4b0);
    auVar77 = vsubps_avx(auVar77,local_4b0);
    fVar165 = auVar77._0_4_;
    fVar164 = fVar165 * 0.04761905;
    auVar221._0_4_ = local_4b0._0_4_;
    auVar221._4_4_ = auVar221._0_4_;
    auVar221._8_4_ = auVar221._0_4_;
    auVar221._12_4_ = auVar221._0_4_;
    auVar221._16_4_ = auVar221._0_4_;
    auVar221._20_4_ = auVar221._0_4_;
    auVar221._24_4_ = auVar221._0_4_;
    auVar221._28_4_ = auVar221._0_4_;
    auVar86._4_4_ = fVar165;
    auVar86._0_4_ = fVar165;
    auVar86._8_4_ = fVar165;
    auVar86._12_4_ = fVar165;
    auVar229._16_4_ = fVar165;
    auVar229._0_16_ = auVar86;
    auVar229._20_4_ = fVar165;
    auVar229._24_4_ = fVar165;
    auVar229._28_4_ = fVar165;
    auVar77 = vfmadd231ps_fma(auVar221,auVar229,_DAT_01f7b040);
    auVar258 = auVar259._0_32_;
    auVar92 = vsubps_avx512vl(auVar258,ZEXT1632(auVar77));
    auVar93 = vmulps_avx512vl(auVar96,ZEXT1632(auVar77));
    auVar108 = ZEXT1632(auVar77);
    fVar165 = auVar77._0_4_;
    fVar177 = auVar77._4_4_;
    auVar118._4_4_ = auVar98._4_4_ * fVar177;
    auVar118._0_4_ = auVar98._0_4_ * fVar165;
    fVar179 = auVar77._8_4_;
    auVar118._8_4_ = auVar98._8_4_ * fVar179;
    fVar181 = auVar77._12_4_;
    auVar118._12_4_ = auVar98._12_4_ * fVar181;
    auVar118._16_4_ = auVar98._16_4_ * 0.0;
    auVar118._20_4_ = auVar98._20_4_ * 0.0;
    auVar118._24_4_ = auVar98._24_4_ * 0.0;
    auVar118._28_4_ = auVar221._0_4_;
    auVar106 = vmulps_avx512vl(auVar97,auVar108);
    auVar107 = vmulps_avx512vl(auVar100,auVar108);
    auVar80 = vfmadd231ps_fma(auVar93,auVar92,auVar249._0_32_);
    auVar81 = vfmadd231ps_fma(auVar118,auVar92,auVar250._0_32_);
    auVar82 = vfmadd231ps_fma(auVar106,auVar92,auVar246._0_32_);
    auVar89 = vfmadd231ps_fma(auVar107,auVar92,auVar248._0_32_);
    auVar93 = vmulps_avx512vl(auVar101,auVar108);
    auVar112 = ZEXT1632(auVar77);
    auVar106 = vmulps_avx512vl(auVar99,auVar112);
    auVar107 = vmulps_avx512vl(auVar102,auVar112);
    auVar108 = vmulps_avx512vl(auVar103,auVar112);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar92,auVar96);
    auVar78 = vfmadd231ps_fma(auVar106,auVar92,auVar98);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar92,auVar97);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar92,auVar100);
    auVar108 = vmulps_avx512vl(auVar104,auVar112);
    auVar109 = vmulps_avx512vl(auVar105,auVar112);
    auVar110 = vmulps_avx512vl(auVar94,auVar112);
    auVar111 = vmulps_avx512vl(auVar95,auVar112);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar92,auVar101);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar92,auVar99);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar92,auVar102);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar92,auVar103);
    auVar128._4_4_ = fVar177 * auVar93._4_4_;
    auVar128._0_4_ = fVar165 * auVar93._0_4_;
    auVar128._8_4_ = fVar179 * auVar93._8_4_;
    auVar128._12_4_ = fVar181 * auVar93._12_4_;
    auVar128._16_4_ = auVar93._16_4_ * 0.0;
    auVar128._20_4_ = auVar93._20_4_ * 0.0;
    auVar128._24_4_ = auVar93._24_4_ * 0.0;
    auVar128._28_4_ = auVar98._28_4_;
    auVar112 = vmulps_avx512vl(auVar112,ZEXT1632(auVar78));
    auVar113 = vmulps_avx512vl(ZEXT1632(auVar77),auVar106);
    auVar114 = vmulps_avx512vl(ZEXT1632(auVar77),auVar107);
    auVar77 = vfmadd231ps_fma(auVar128,auVar92,ZEXT1632(auVar80));
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar92,ZEXT1632(auVar81));
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar92,ZEXT1632(auVar82));
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar92,ZEXT1632(auVar89));
    auVar133._0_4_ = auVar108._0_4_ * fVar165;
    auVar133._4_4_ = auVar108._4_4_ * fVar177;
    auVar133._8_4_ = auVar108._8_4_ * fVar179;
    auVar133._12_4_ = auVar108._12_4_ * fVar181;
    auVar133._16_4_ = auVar108._16_4_ * 0.0;
    auVar133._20_4_ = auVar108._20_4_ * 0.0;
    auVar133._24_4_ = auVar108._24_4_ * 0.0;
    auVar133._28_4_ = 0;
    auVar124._4_4_ = auVar109._4_4_ * fVar177;
    auVar124._0_4_ = auVar109._0_4_ * fVar165;
    auVar124._8_4_ = auVar109._8_4_ * fVar179;
    auVar124._12_4_ = auVar109._12_4_ * fVar181;
    auVar124._16_4_ = auVar109._16_4_ * 0.0;
    auVar124._20_4_ = auVar109._20_4_ * 0.0;
    auVar124._24_4_ = auVar109._24_4_ * 0.0;
    auVar124._28_4_ = auVar108._28_4_;
    auVar125._4_4_ = auVar110._4_4_ * fVar177;
    auVar125._0_4_ = auVar110._0_4_ * fVar165;
    auVar125._8_4_ = auVar110._8_4_ * fVar179;
    auVar125._12_4_ = auVar110._12_4_ * fVar181;
    auVar125._16_4_ = auVar110._16_4_ * 0.0;
    auVar125._20_4_ = auVar110._20_4_ * 0.0;
    auVar125._24_4_ = auVar110._24_4_ * 0.0;
    auVar125._28_4_ = auVar109._28_4_;
    auVar126._4_4_ = auVar111._4_4_ * fVar177;
    auVar126._0_4_ = auVar111._0_4_ * fVar165;
    auVar126._8_4_ = auVar111._8_4_ * fVar179;
    auVar126._12_4_ = auVar111._12_4_ * fVar181;
    auVar126._16_4_ = auVar111._16_4_ * 0.0;
    auVar126._20_4_ = auVar111._20_4_ * 0.0;
    auVar126._24_4_ = auVar111._24_4_ * 0.0;
    auVar126._28_4_ = auVar110._28_4_;
    auVar80 = vfmadd231ps_fma(auVar133,auVar92,auVar93);
    auVar81 = vfmadd231ps_fma(auVar124,auVar92,ZEXT1632(auVar78));
    auVar82 = vfmadd231ps_fma(auVar125,auVar92,auVar106);
    auVar89 = vfmadd231ps_fma(auVar126,auVar92,auVar107);
    auVar78 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar181 * auVar80._12_4_,
                                                 CONCAT48(fVar179 * auVar80._8_4_,
                                                          CONCAT44(fVar177 * auVar80._4_4_,
                                                                   fVar165 * auVar80._0_4_)))),
                              auVar92,ZEXT1632(auVar77));
    auVar109 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar81._12_4_ * fVar181,
                                             CONCAT48(auVar81._8_4_ * fVar179,
                                                      CONCAT44(auVar81._4_4_ * fVar177,
                                                               auVar81._0_4_ * fVar165)))),auVar92,
                          auVar112);
    auVar110 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar82._12_4_ * fVar181,
                                             CONCAT48(auVar82._8_4_ * fVar179,
                                                      CONCAT44(auVar82._4_4_ * fVar177,
                                                               auVar82._0_4_ * fVar165)))),auVar92,
                          auVar113);
    auVar93 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar89._12_4_ * fVar181,
                                            CONCAT48(auVar89._8_4_ * fVar179,
                                                     CONCAT44(auVar89._4_4_ * fVar177,
                                                              auVar89._0_4_ * fVar165)))),auVar114,
                         auVar92);
    auVar92 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar77));
    auVar106 = vsubps_avx512vl(ZEXT1632(auVar81),auVar112);
    auVar107 = vsubps_avx512vl(ZEXT1632(auVar82),auVar113);
    auVar108 = vsubps_avx512vl(ZEXT1632(auVar89),auVar114);
    auVar251._0_4_ = fVar164 * auVar92._0_4_ * 3.0;
    auVar251._4_4_ = fVar164 * auVar92._4_4_ * 3.0;
    auVar251._8_4_ = fVar164 * auVar92._8_4_ * 3.0;
    auVar251._12_4_ = fVar164 * auVar92._12_4_ * 3.0;
    auVar251._16_4_ = fVar164 * auVar92._16_4_ * 3.0;
    auVar251._20_4_ = fVar164 * auVar92._20_4_ * 3.0;
    auVar251._24_4_ = fVar164 * auVar92._24_4_ * 3.0;
    auVar251._28_4_ = 0;
    auVar254._0_4_ = fVar164 * auVar106._0_4_ * 3.0;
    auVar254._4_4_ = fVar164 * auVar106._4_4_ * 3.0;
    auVar254._8_4_ = fVar164 * auVar106._8_4_ * 3.0;
    auVar254._12_4_ = fVar164 * auVar106._12_4_ * 3.0;
    auVar254._16_4_ = fVar164 * auVar106._16_4_ * 3.0;
    auVar254._20_4_ = fVar164 * auVar106._20_4_ * 3.0;
    auVar254._24_4_ = fVar164 * auVar106._24_4_ * 3.0;
    auVar254._28_4_ = 0;
    auVar132._4_4_ = fVar164 * auVar107._4_4_ * 3.0;
    auVar132._0_4_ = fVar164 * auVar107._0_4_ * 3.0;
    auVar132._8_4_ = fVar164 * auVar107._8_4_ * 3.0;
    auVar132._12_4_ = fVar164 * auVar107._12_4_ * 3.0;
    auVar132._16_4_ = fVar164 * auVar107._16_4_ * 3.0;
    auVar132._20_4_ = fVar164 * auVar107._20_4_ * 3.0;
    auVar132._24_4_ = fVar164 * auVar107._24_4_ * 3.0;
    auVar132._28_4_ = auVar111._28_4_;
    fVar165 = auVar108._0_4_ * 3.0 * fVar164;
    fVar177 = auVar108._4_4_ * 3.0 * fVar164;
    auVar230._4_4_ = fVar177;
    auVar230._0_4_ = fVar165;
    fVar179 = auVar108._8_4_ * 3.0 * fVar164;
    auVar230._8_4_ = fVar179;
    fVar181 = auVar108._12_4_ * 3.0 * fVar164;
    auVar230._12_4_ = fVar181;
    fVar183 = auVar108._16_4_ * 3.0 * fVar164;
    auVar230._16_4_ = fVar183;
    fVar206 = auVar108._20_4_ * 3.0 * fVar164;
    auVar230._20_4_ = fVar206;
    fVar186 = auVar108._24_4_ * 3.0 * fVar164;
    auVar230._24_4_ = fVar186;
    auVar230._28_4_ = fVar164;
    auVar77 = vxorps_avx512vl(auVar96._0_16_,auVar96._0_16_);
    auVar111 = vpermt2ps_avx512vl(ZEXT1632(auVar78),_DAT_01fb9fc0,ZEXT1632(auVar77));
    auVar112 = vpermt2ps_avx512vl(auVar109,_DAT_01fb9fc0,ZEXT1632(auVar77));
    auVar106 = ZEXT1632(auVar77);
    auVar113 = vpermt2ps_avx512vl(auVar110,_DAT_01fb9fc0,auVar106);
    auVar129._0_4_ = auVar93._0_4_ + fVar165;
    auVar129._4_4_ = auVar93._4_4_ + fVar177;
    auVar129._8_4_ = auVar93._8_4_ + fVar179;
    auVar129._12_4_ = auVar93._12_4_ + fVar181;
    auVar129._16_4_ = auVar93._16_4_ + fVar183;
    auVar129._20_4_ = auVar93._20_4_ + fVar206;
    auVar129._24_4_ = auVar93._24_4_ + fVar186;
    auVar129._28_4_ = auVar93._28_4_ + fVar164;
    auVar92 = vmaxps_avx(auVar93,auVar129);
    auVar114 = vminps_avx512vl(auVar93,auVar129);
    auVar115 = vpermt2ps_avx512vl(auVar93,_DAT_01fb9fc0,auVar106);
    auVar116 = vpermt2ps_avx512vl(auVar251,_DAT_01fb9fc0,auVar106);
    auVar117 = vpermt2ps_avx512vl(auVar254,_DAT_01fb9fc0,auVar106);
    auVar128 = ZEXT1632(auVar77);
    auVar118 = vpermt2ps_avx512vl(auVar132,_DAT_01fb9fc0,auVar128);
    auVar93 = vpermt2ps_avx512vl(auVar230,_DAT_01fb9fc0,auVar128);
    auVar93 = vsubps_avx(auVar115,auVar93);
    auVar106 = vsubps_avx(auVar111,ZEXT1632(auVar78));
    auVar107 = vsubps_avx(auVar112,auVar109);
    auVar108 = vsubps_avx(auVar113,auVar110);
    auVar119 = vmulps_avx512vl(auVar107,auVar132);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar254,auVar108);
    auVar120 = vmulps_avx512vl(auVar108,auVar251);
    auVar120 = vfmsub231ps_avx512vl(auVar120,auVar132,auVar106);
    auVar121 = vmulps_avx512vl(auVar106,auVar254);
    auVar121 = vfmsub231ps_avx512vl(auVar121,auVar251,auVar107);
    auVar121 = vmulps_avx512vl(auVar121,auVar121);
    auVar120 = vfmadd231ps_avx512vl(auVar121,auVar120,auVar120);
    auVar119 = vfmadd231ps_avx512vl(auVar120,auVar119,auVar119);
    auVar120 = vmulps_avx512vl(auVar108,auVar108);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar107,auVar107);
    auVar122 = vfmadd231ps_avx512vl(auVar120,auVar106,auVar106);
    auVar120 = vrcp14ps_avx512vl(auVar122);
    auVar121 = vfnmadd213ps_avx512vl(auVar120,auVar122,auVar258);
    auVar120 = vfmadd132ps_avx512vl(auVar121,auVar120,auVar120);
    auVar119 = vmulps_avx512vl(auVar119,auVar120);
    auVar121 = vmulps_avx512vl(auVar107,auVar118);
    auVar121 = vfmsub231ps_avx512vl(auVar121,auVar117,auVar108);
    auVar123 = vmulps_avx512vl(auVar108,auVar116);
    auVar123 = vfmsub231ps_avx512vl(auVar123,auVar118,auVar106);
    auVar124 = vmulps_avx512vl(auVar106,auVar117);
    auVar124 = vfmsub231ps_avx512vl(auVar124,auVar116,auVar107);
    auVar124 = vmulps_avx512vl(auVar124,auVar124);
    auVar123 = vfmadd231ps_avx512vl(auVar124,auVar123,auVar123);
    auVar121 = vfmadd231ps_avx512vl(auVar123,auVar121,auVar121);
    auVar120 = vmulps_avx512vl(auVar121,auVar120);
    auVar119 = vmaxps_avx512vl(auVar119,auVar120);
    auVar119 = vsqrtps_avx512vl(auVar119);
    auVar120 = vmaxps_avx512vl(auVar93,auVar115);
    auVar92 = vmaxps_avx512vl(auVar92,auVar120);
    auVar123 = vaddps_avx512vl(auVar119,auVar92);
    auVar92 = vminps_avx(auVar93,auVar115);
    auVar92 = vminps_avx512vl(auVar114,auVar92);
    auVar92 = vsubps_avx512vl(auVar92,auVar119);
    auVar119._8_4_ = 0x3f800002;
    auVar119._0_8_ = 0x3f8000023f800002;
    auVar119._12_4_ = 0x3f800002;
    auVar119._16_4_ = 0x3f800002;
    auVar119._20_4_ = 0x3f800002;
    auVar119._24_4_ = 0x3f800002;
    auVar119._28_4_ = 0x3f800002;
    auVar93 = vmulps_avx512vl(auVar123,auVar119);
    auVar120._8_4_ = 0x3f7ffffc;
    auVar120._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar120._12_4_ = 0x3f7ffffc;
    auVar120._16_4_ = 0x3f7ffffc;
    auVar120._20_4_ = 0x3f7ffffc;
    auVar120._24_4_ = 0x3f7ffffc;
    auVar120._28_4_ = 0x3f7ffffc;
    local_860 = vmulps_avx512vl(auVar92,auVar120);
    auVar92 = vmulps_avx512vl(auVar93,auVar93);
    auVar93 = vrsqrt14ps_avx512vl(auVar122);
    auVar121._8_4_ = 0xbf000000;
    auVar121._0_8_ = 0xbf000000bf000000;
    auVar121._12_4_ = 0xbf000000;
    auVar121._16_4_ = 0xbf000000;
    auVar121._20_4_ = 0xbf000000;
    auVar121._24_4_ = 0xbf000000;
    auVar121._28_4_ = 0xbf000000;
    auVar114 = vmulps_avx512vl(auVar122,auVar121);
    fVar165 = auVar93._0_4_;
    fVar177 = auVar93._4_4_;
    fVar179 = auVar93._8_4_;
    fVar181 = auVar93._12_4_;
    fVar164 = auVar93._16_4_;
    fVar183 = auVar93._20_4_;
    fVar206 = auVar93._24_4_;
    auVar127._4_4_ = fVar177 * fVar177 * fVar177 * auVar114._4_4_;
    auVar127._0_4_ = fVar165 * fVar165 * fVar165 * auVar114._0_4_;
    auVar127._8_4_ = fVar179 * fVar179 * fVar179 * auVar114._8_4_;
    auVar127._12_4_ = fVar181 * fVar181 * fVar181 * auVar114._12_4_;
    auVar127._16_4_ = fVar164 * fVar164 * fVar164 * auVar114._16_4_;
    auVar127._20_4_ = fVar183 * fVar183 * fVar183 * auVar114._20_4_;
    auVar127._24_4_ = fVar206 * fVar206 * fVar206 * auVar114._24_4_;
    auVar127._28_4_ = auVar123._28_4_;
    auVar122._8_4_ = 0x3fc00000;
    auVar122._0_8_ = 0x3fc000003fc00000;
    auVar122._12_4_ = 0x3fc00000;
    auVar122._16_4_ = 0x3fc00000;
    auVar122._20_4_ = 0x3fc00000;
    auVar122._24_4_ = 0x3fc00000;
    auVar122._28_4_ = 0x3fc00000;
    auVar93 = vfmadd231ps_avx512vl(auVar127,auVar93,auVar122);
    auVar114 = vmulps_avx512vl(auVar106,auVar93);
    auVar115 = vmulps_avx512vl(auVar107,auVar93);
    auVar119 = vmulps_avx512vl(auVar108,auVar93);
    auVar230 = ZEXT1632(auVar78);
    auVar120 = vsubps_avx512vl(auVar128,auVar230);
    auVar121 = vsubps_avx512vl(auVar128,auVar109);
    auVar122 = vsubps_avx512vl(auVar128,auVar110);
    auVar123 = vmulps_avx512vl(auVar257._0_32_,auVar122);
    auVar123 = vfmadd231ps_avx512vl(auVar123,local_420,auVar121);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar256._0_32_,auVar120);
    auVar124 = vmulps_avx512vl(auVar122,auVar122);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar121,auVar121);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar120,auVar120);
    auVar125 = vmulps_avx512vl(auVar257._0_32_,auVar119);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar115,local_420);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar114,auVar256._0_32_);
    auVar119 = vmulps_avx512vl(auVar122,auVar119);
    auVar115 = vfmadd231ps_avx512vl(auVar119,auVar121,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar120,auVar114);
    auVar115 = vmulps_avx512vl(auVar125,auVar125);
    auVar119 = vsubps_avx512vl(local_220,auVar115);
    auVar126 = vmulps_avx512vl(auVar125,auVar114);
    auVar123 = vsubps_avx512vl(auVar123,auVar126);
    auVar126 = vaddps_avx512vl(auVar123,auVar123);
    auVar123 = vmulps_avx512vl(auVar114,auVar114);
    auVar124 = vsubps_avx512vl(auVar124,auVar123);
    auVar92 = vsubps_avx512vl(auVar124,auVar92);
    local_540 = vmulps_avx512vl(auVar126,auVar126);
    auVar123._8_4_ = 0x40800000;
    auVar123._0_8_ = 0x4080000040800000;
    auVar123._12_4_ = 0x40800000;
    auVar123._16_4_ = 0x40800000;
    auVar123._20_4_ = 0x40800000;
    auVar123._24_4_ = 0x40800000;
    auVar123._28_4_ = 0x40800000;
    _local_560 = vmulps_avx512vl(auVar119,auVar123);
    auVar123 = vmulps_avx512vl(_local_560,auVar92);
    auVar123 = vsubps_avx512vl(local_540,auVar123);
    uVar75 = vcmpps_avx512vl(auVar123,auVar128,5);
    bVar62 = (byte)uVar75;
    fVar165 = (float)local_720._0_4_;
    fVar177 = (float)local_720._4_4_;
    fVar179 = fStack_718;
    fVar181 = fStack_714;
    fVar164 = fStack_710;
    fVar183 = fStack_70c;
    fVar206 = fStack_708;
    fVar186 = fStack_704;
    if (bVar62 == 0) {
      auVar241 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
LAB_01a0ec40:
      auVar256 = ZEXT3264(local_740);
      auVar257 = ZEXT3264(local_760);
      auVar249 = ZEXT3264(local_800);
      auVar250 = ZEXT3264(local_820);
      auVar246 = ZEXT3264(local_7c0);
      auVar248 = ZEXT3264(local_7e0);
    }
    else {
      auVar123 = vsqrtps_avx512vl(auVar123);
      auVar127 = vaddps_avx512vl(auVar119,auVar119);
      _local_7a0 = vrcp14ps_avx512vl(auVar127);
      auVar128 = vfnmadd213ps_avx512vl(_local_7a0,auVar127,auVar258);
      auVar128 = vfmadd132ps_avx512vl(auVar128,_local_7a0,_local_7a0);
      auVar258._8_4_ = 0x80000000;
      auVar258._0_8_ = 0x8000000080000000;
      auVar258._12_4_ = 0x80000000;
      auVar258._16_4_ = 0x80000000;
      auVar258._20_4_ = 0x80000000;
      auVar258._24_4_ = 0x80000000;
      auVar258._28_4_ = 0x80000000;
      local_580 = vxorps_avx512vl(auVar126,auVar258);
      auVar129 = vsubps_avx512vl(local_580,auVar123);
      local_700 = vmulps_avx512vl(auVar129,auVar128);
      auVar123 = vsubps_avx512vl(auVar123,auVar126);
      local_5a0 = vmulps_avx512vl(auVar123,auVar128);
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar128 = vblendmps_avx512vl(auVar123,local_700);
      auVar130._0_4_ =
           (uint)(bVar62 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar123._0_4_;
      bVar72 = (bool)((byte)(uVar75 >> 1) & 1);
      auVar130._4_4_ = (uint)bVar72 * auVar128._4_4_ | (uint)!bVar72 * auVar123._4_4_;
      bVar72 = (bool)((byte)(uVar75 >> 2) & 1);
      auVar130._8_4_ = (uint)bVar72 * auVar128._8_4_ | (uint)!bVar72 * auVar123._8_4_;
      bVar72 = (bool)((byte)(uVar75 >> 3) & 1);
      auVar130._12_4_ = (uint)bVar72 * auVar128._12_4_ | (uint)!bVar72 * auVar123._12_4_;
      bVar72 = (bool)((byte)(uVar75 >> 4) & 1);
      auVar130._16_4_ = (uint)bVar72 * auVar128._16_4_ | (uint)!bVar72 * auVar123._16_4_;
      bVar72 = (bool)((byte)(uVar75 >> 5) & 1);
      auVar130._20_4_ = (uint)bVar72 * auVar128._20_4_ | (uint)!bVar72 * auVar123._20_4_;
      bVar72 = (bool)((byte)(uVar75 >> 6) & 1);
      auVar130._24_4_ = (uint)bVar72 * auVar128._24_4_ | (uint)!bVar72 * auVar123._24_4_;
      bVar72 = SUB81(uVar75 >> 7,0);
      auVar130._28_4_ = (uint)bVar72 * auVar128._28_4_ | (uint)!bVar72 * auVar123._28_4_;
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar128 = vblendmps_avx512vl(auVar123,local_5a0);
      auVar131._0_4_ =
           (uint)(bVar62 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar123._0_4_;
      bVar72 = (bool)((byte)(uVar75 >> 1) & 1);
      auVar131._4_4_ = (uint)bVar72 * auVar128._4_4_ | (uint)!bVar72 * auVar123._4_4_;
      bVar72 = (bool)((byte)(uVar75 >> 2) & 1);
      auVar131._8_4_ = (uint)bVar72 * auVar128._8_4_ | (uint)!bVar72 * auVar123._8_4_;
      bVar72 = (bool)((byte)(uVar75 >> 3) & 1);
      auVar131._12_4_ = (uint)bVar72 * auVar128._12_4_ | (uint)!bVar72 * auVar123._12_4_;
      bVar72 = (bool)((byte)(uVar75 >> 4) & 1);
      auVar131._16_4_ = (uint)bVar72 * auVar128._16_4_ | (uint)!bVar72 * auVar123._16_4_;
      bVar72 = (bool)((byte)(uVar75 >> 5) & 1);
      auVar131._20_4_ = (uint)bVar72 * auVar128._20_4_ | (uint)!bVar72 * auVar123._20_4_;
      bVar72 = (bool)((byte)(uVar75 >> 6) & 1);
      auVar131._24_4_ = (uint)bVar72 * auVar128._24_4_ | (uint)!bVar72 * auVar123._24_4_;
      bVar72 = SUB81(uVar75 >> 7,0);
      auVar131._28_4_ = (uint)bVar72 * auVar128._28_4_ | (uint)!bVar72 * auVar123._28_4_;
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar115,auVar123);
      local_5c0 = vmaxps_avx512vl(local_240,auVar123);
      auVar31._8_4_ = 0x36000000;
      auVar31._0_8_ = 0x3600000036000000;
      auVar31._12_4_ = 0x36000000;
      auVar31._16_4_ = 0x36000000;
      auVar31._20_4_ = 0x36000000;
      auVar31._24_4_ = 0x36000000;
      auVar31._28_4_ = 0x36000000;
      local_5e0 = vmulps_avx512vl(local_5c0,auVar31);
      vandps_avx512vl(auVar119,auVar123);
      uVar18 = vcmpps_avx512vl(local_5e0,local_5e0,1);
      uVar75 = uVar75 & uVar18;
      bVar70 = (byte)uVar75;
      if (bVar70 != 0) {
        uVar18 = vcmpps_avx512vl(auVar92,_DAT_01f7b000,2);
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar119 = vblendmps_avx512vl(auVar92,auVar115);
        bVar68 = (byte)uVar18;
        uVar76 = (uint)(bVar68 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar68 & 1) * local_5e0._0_4_;
        bVar72 = (bool)((byte)(uVar18 >> 1) & 1);
        uVar143 = (uint)bVar72 * auVar119._4_4_ | (uint)!bVar72 * local_5e0._4_4_;
        bVar72 = (bool)((byte)(uVar18 >> 2) & 1);
        uVar144 = (uint)bVar72 * auVar119._8_4_ | (uint)!bVar72 * local_5e0._8_4_;
        bVar72 = (bool)((byte)(uVar18 >> 3) & 1);
        uVar145 = (uint)bVar72 * auVar119._12_4_ | (uint)!bVar72 * local_5e0._12_4_;
        bVar72 = (bool)((byte)(uVar18 >> 4) & 1);
        uVar146 = (uint)bVar72 * auVar119._16_4_ | (uint)!bVar72 * local_5e0._16_4_;
        bVar72 = (bool)((byte)(uVar18 >> 5) & 1);
        uVar147 = (uint)bVar72 * auVar119._20_4_ | (uint)!bVar72 * local_5e0._20_4_;
        bVar72 = (bool)((byte)(uVar18 >> 6) & 1);
        uVar148 = (uint)bVar72 * auVar119._24_4_ | (uint)!bVar72 * local_5e0._24_4_;
        bVar72 = SUB81(uVar18 >> 7,0);
        uVar149 = (uint)bVar72 * auVar119._28_4_ | (uint)!bVar72 * local_5e0._28_4_;
        auVar130._0_4_ = (bVar70 & 1) * uVar76 | !(bool)(bVar70 & 1) * auVar130._0_4_;
        bVar72 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar130._4_4_ = bVar72 * uVar143 | !bVar72 * auVar130._4_4_;
        bVar72 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar130._8_4_ = bVar72 * uVar144 | !bVar72 * auVar130._8_4_;
        bVar72 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar130._12_4_ = bVar72 * uVar145 | !bVar72 * auVar130._12_4_;
        bVar72 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar130._16_4_ = bVar72 * uVar146 | !bVar72 * auVar130._16_4_;
        bVar72 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar130._20_4_ = bVar72 * uVar147 | !bVar72 * auVar130._20_4_;
        bVar72 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar130._24_4_ = bVar72 * uVar148 | !bVar72 * auVar130._24_4_;
        bVar72 = SUB81(uVar75 >> 7,0);
        auVar130._28_4_ = bVar72 * uVar149 | !bVar72 * auVar130._28_4_;
        auVar92 = vblendmps_avx512vl(auVar115,auVar92);
        bVar72 = (bool)((byte)(uVar18 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar18 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar18 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar18 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar18 >> 5) & 1);
        bVar14 = (bool)((byte)(uVar18 >> 6) & 1);
        bVar15 = SUB81(uVar18 >> 7,0);
        auVar131._0_4_ =
             (uint)(bVar70 & 1) *
             ((uint)(bVar68 & 1) * auVar92._0_4_ | !(bool)(bVar68 & 1) * uVar76) |
             !(bool)(bVar70 & 1) * auVar131._0_4_;
        bVar9 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar131._4_4_ =
             (uint)bVar9 * ((uint)bVar72 * auVar92._4_4_ | !bVar72 * uVar143) |
             !bVar9 * auVar131._4_4_;
        bVar72 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar131._8_4_ =
             (uint)bVar72 * ((uint)bVar10 * auVar92._8_4_ | !bVar10 * uVar144) |
             !bVar72 * auVar131._8_4_;
        bVar72 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar131._12_4_ =
             (uint)bVar72 * ((uint)bVar11 * auVar92._12_4_ | !bVar11 * uVar145) |
             !bVar72 * auVar131._12_4_;
        bVar72 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar131._16_4_ =
             (uint)bVar72 * ((uint)bVar12 * auVar92._16_4_ | !bVar12 * uVar146) |
             !bVar72 * auVar131._16_4_;
        bVar72 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar131._20_4_ =
             (uint)bVar72 * ((uint)bVar13 * auVar92._20_4_ | !bVar13 * uVar147) |
             !bVar72 * auVar131._20_4_;
        bVar72 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar131._24_4_ =
             (uint)bVar72 * ((uint)bVar14 * auVar92._24_4_ | !bVar14 * uVar148) |
             !bVar72 * auVar131._24_4_;
        bVar72 = SUB81(uVar75 >> 7,0);
        auVar131._28_4_ =
             (uint)bVar72 * ((uint)bVar15 * auVar92._28_4_ | !bVar15 * uVar149) |
             !bVar72 * auVar131._28_4_;
        bVar62 = (~bVar70 | bVar68) & bVar62;
      }
      if ((bVar62 & 0x7f) == 0) {
        auVar241 = ZEXT3264(CONCAT428(0x7fffffff,
                                      CONCAT424(0x7fffffff,
                                                CONCAT420(0x7fffffff,
                                                          CONCAT416(0x7fffffff,
                                                                    CONCAT412(0x7fffffff,
                                                                              CONCAT48(0x7fffffff,
                                                                                                                                                                              
                                                  0x7fffffff7fffffff)))))));
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar259 = ZEXT3264(auVar92);
        goto LAB_01a0ec40;
      }
      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar115 = vxorps_avx512vl(auVar118,auVar92);
      auVar116 = vxorps_avx512vl(auVar116,auVar92);
      uVar76 = *(uint *)((long)&pre->ray_space[4].vz.field_0 + (long)ray * 4);
      auVar259 = ZEXT464(uVar76);
      auVar117 = vxorps_avx512vl(auVar117,auVar92);
      auVar77 = vsubss_avx512f(ZEXT416(uVar76),ZEXT416((uint)local_6b0._0_4_));
      auVar119 = vbroadcastss_avx512vl(auVar77);
      auVar119 = vminps_avx512vl(auVar119,auVar131);
      auVar61._4_4_ = fStack_25c;
      auVar61._0_4_ = local_260;
      auVar61._8_4_ = fStack_258;
      auVar61._12_4_ = fStack_254;
      auVar61._16_4_ = fStack_250;
      auVar61._20_4_ = fStack_24c;
      auVar61._24_4_ = fStack_248;
      auVar61._28_4_ = fStack_244;
      auVar123 = vmaxps_avx512vl(auVar61,auVar130);
      auVar122 = vmulps_avx512vl(auVar122,auVar132);
      auVar121 = vfmadd213ps_avx512vl(auVar121,auVar254,auVar122);
      auVar77 = vfmadd213ps_fma(auVar120,auVar251,auVar121);
      auVar120 = vmulps_avx512vl(local_760,auVar132);
      auVar120 = vfmadd231ps_avx512vl(auVar120,local_420,auVar254);
      auVar120 = vfmadd231ps_avx512vl(auVar120,local_740,auVar251);
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar120,auVar121);
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar17 = vcmpps_avx512vl(auVar121,auVar122,1);
      auVar118 = vxorps_avx512vl(ZEXT1632(auVar77),auVar92);
      auVar132 = vrcp14ps_avx512vl(auVar120);
      auVar128 = vxorps_avx512vl(auVar120,auVar92);
      auVar129 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar133 = vfnmadd213ps_avx512vl(auVar132,auVar120,auVar129);
      auVar77 = vfmadd132ps_fma(auVar133,auVar132,auVar132);
      fVar166 = auVar77._0_4_ * auVar118._0_4_;
      fVar178 = auVar77._4_4_ * auVar118._4_4_;
      auVar38._4_4_ = fVar178;
      auVar38._0_4_ = fVar166;
      fVar180 = auVar77._8_4_ * auVar118._8_4_;
      auVar38._8_4_ = fVar180;
      fVar182 = auVar77._12_4_ * auVar118._12_4_;
      auVar38._12_4_ = fVar182;
      fVar184 = auVar118._16_4_ * 0.0;
      auVar38._16_4_ = fVar184;
      fVar185 = auVar118._20_4_ * 0.0;
      auVar38._20_4_ = fVar185;
      fVar187 = auVar118._24_4_ * 0.0;
      auVar38._24_4_ = fVar187;
      auVar38._28_4_ = auVar118._28_4_;
      uVar20 = vcmpps_avx512vl(auVar120,auVar128,1);
      bVar70 = (byte)uVar17 | (byte)uVar20;
      auVar252._8_4_ = 0xff800000;
      auVar252._0_8_ = 0xff800000ff800000;
      auVar252._12_4_ = 0xff800000;
      auVar252._16_4_ = 0xff800000;
      auVar252._20_4_ = 0xff800000;
      auVar252._24_4_ = 0xff800000;
      auVar252._28_4_ = 0xff800000;
      auVar132 = vblendmps_avx512vl(auVar38,auVar252);
      auVar134._0_4_ = (uint)(bVar70 & 1) * auVar132._0_4_ | (uint)!(bool)(bVar70 & 1) * -0x800000;
      bVar72 = (bool)(bVar70 >> 1 & 1);
      auVar134._4_4_ = (uint)bVar72 * auVar132._4_4_ | (uint)!bVar72 * -0x800000;
      bVar72 = (bool)(bVar70 >> 2 & 1);
      auVar134._8_4_ = (uint)bVar72 * auVar132._8_4_ | (uint)!bVar72 * -0x800000;
      bVar72 = (bool)(bVar70 >> 3 & 1);
      auVar134._12_4_ = (uint)bVar72 * auVar132._12_4_ | (uint)!bVar72 * -0x800000;
      bVar72 = (bool)(bVar70 >> 4 & 1);
      auVar134._16_4_ = (uint)bVar72 * auVar132._16_4_ | (uint)!bVar72 * -0x800000;
      bVar72 = (bool)(bVar70 >> 5 & 1);
      auVar134._20_4_ = (uint)bVar72 * auVar132._20_4_ | (uint)!bVar72 * -0x800000;
      bVar72 = (bool)(bVar70 >> 6 & 1);
      auVar134._24_4_ = (uint)bVar72 * auVar132._24_4_ | (uint)!bVar72 * -0x800000;
      auVar134._28_4_ =
           (uint)(bVar70 >> 7) * auVar132._28_4_ | (uint)!(bool)(bVar70 >> 7) * -0x800000;
      auVar132 = vmaxps_avx512vl(auVar123,auVar134);
      uVar20 = vcmpps_avx512vl(auVar120,auVar128,6);
      bVar70 = (byte)uVar17 | (byte)uVar20;
      auVar135._0_4_ = (uint)(bVar70 & 1) * 0x7f800000 | (uint)!(bool)(bVar70 & 1) * (int)fVar166;
      bVar72 = (bool)(bVar70 >> 1 & 1);
      auVar135._4_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar178;
      bVar72 = (bool)(bVar70 >> 2 & 1);
      auVar135._8_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar180;
      bVar72 = (bool)(bVar70 >> 3 & 1);
      auVar135._12_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar182;
      bVar72 = (bool)(bVar70 >> 4 & 1);
      auVar135._16_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar184;
      bVar72 = (bool)(bVar70 >> 5 & 1);
      auVar135._20_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar185;
      bVar72 = (bool)(bVar70 >> 6 & 1);
      auVar135._24_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar187;
      auVar135._28_4_ =
           (uint)(bVar70 >> 7) * 0x7f800000 | (uint)!(bool)(bVar70 >> 7) * auVar118._28_4_;
      auVar119 = vminps_avx512vl(auVar119,auVar135);
      auVar77 = vxorps_avx512vl(auVar123._0_16_,auVar123._0_16_);
      auVar111 = vsubps_avx512vl(ZEXT1632(auVar77),auVar111);
      auVar112 = vsubps_avx512vl(ZEXT1632(auVar77),auVar112);
      auVar120 = ZEXT1632(auVar77);
      auVar113 = vsubps_avx512vl(auVar120,auVar113);
      auVar113 = vmulps_avx512vl(auVar113,auVar115);
      auVar112 = vfmadd231ps_avx512vl(auVar113,auVar117,auVar112);
      auVar111 = vfmadd231ps_avx512vl(auVar112,auVar116,auVar111);
      auVar112 = vmulps_avx512vl(local_760,auVar115);
      auVar112 = vfmadd231ps_avx512vl(auVar112,local_420,auVar117);
      auVar112 = vfmadd231ps_avx512vl(auVar112,local_740,auVar116);
      vandps_avx512vl(auVar112,auVar121);
      uVar17 = vcmpps_avx512vl(auVar112,auVar122,1);
      auVar111 = vxorps_avx512vl(auVar111,auVar92);
      auVar113 = vrcp14ps_avx512vl(auVar112);
      auVar92 = vxorps_avx512vl(auVar112,auVar92);
      auVar115 = vfnmadd213ps_avx512vl(auVar113,auVar112,auVar129);
      auVar77 = vfmadd132ps_fma(auVar115,auVar113,auVar113);
      fVar166 = auVar77._0_4_ * auVar111._0_4_;
      fVar178 = auVar77._4_4_ * auVar111._4_4_;
      auVar39._4_4_ = fVar178;
      auVar39._0_4_ = fVar166;
      fVar180 = auVar77._8_4_ * auVar111._8_4_;
      auVar39._8_4_ = fVar180;
      fVar182 = auVar77._12_4_ * auVar111._12_4_;
      auVar39._12_4_ = fVar182;
      fVar184 = auVar111._16_4_ * 0.0;
      auVar39._16_4_ = fVar184;
      fVar185 = auVar111._20_4_ * 0.0;
      auVar39._20_4_ = fVar185;
      fVar187 = auVar111._24_4_ * 0.0;
      auVar39._24_4_ = fVar187;
      auVar39._28_4_ = auVar111._28_4_;
      uVar20 = vcmpps_avx512vl(auVar112,auVar92,1);
      bVar70 = (byte)uVar17 | (byte)uVar20;
      auVar32._8_4_ = 0xff800000;
      auVar32._0_8_ = 0xff800000ff800000;
      auVar32._12_4_ = 0xff800000;
      auVar32._16_4_ = 0xff800000;
      auVar32._20_4_ = 0xff800000;
      auVar32._24_4_ = 0xff800000;
      auVar32._28_4_ = 0xff800000;
      auVar115 = vblendmps_avx512vl(auVar39,auVar32);
      auVar136._0_4_ =
           (uint)(bVar70 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar113._0_4_;
      bVar72 = (bool)(bVar70 >> 1 & 1);
      auVar136._4_4_ = (uint)bVar72 * auVar115._4_4_ | (uint)!bVar72 * auVar113._4_4_;
      bVar72 = (bool)(bVar70 >> 2 & 1);
      auVar136._8_4_ = (uint)bVar72 * auVar115._8_4_ | (uint)!bVar72 * auVar113._8_4_;
      bVar72 = (bool)(bVar70 >> 3 & 1);
      auVar136._12_4_ = (uint)bVar72 * auVar115._12_4_ | (uint)!bVar72 * auVar113._12_4_;
      bVar72 = (bool)(bVar70 >> 4 & 1);
      auVar136._16_4_ = (uint)bVar72 * auVar115._16_4_ | (uint)!bVar72 * auVar113._16_4_;
      bVar72 = (bool)(bVar70 >> 5 & 1);
      auVar136._20_4_ = (uint)bVar72 * auVar115._20_4_ | (uint)!bVar72 * auVar113._20_4_;
      bVar72 = (bool)(bVar70 >> 6 & 1);
      auVar136._24_4_ = (uint)bVar72 * auVar115._24_4_ | (uint)!bVar72 * auVar113._24_4_;
      auVar136._28_4_ =
           (uint)(bVar70 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar70 >> 7) * auVar113._28_4_;
      local_520 = vmaxps_avx(auVar132,auVar136);
      uVar20 = vcmpps_avx512vl(auVar112,auVar92,6);
      bVar70 = (byte)uVar17 | (byte)uVar20;
      auVar137._0_4_ = (uint)(bVar70 & 1) * 0x7f800000 | (uint)!(bool)(bVar70 & 1) * (int)fVar166;
      bVar72 = (bool)(bVar70 >> 1 & 1);
      auVar137._4_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar178;
      bVar72 = (bool)(bVar70 >> 2 & 1);
      auVar137._8_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar180;
      bVar72 = (bool)(bVar70 >> 3 & 1);
      auVar137._12_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar182;
      bVar72 = (bool)(bVar70 >> 4 & 1);
      auVar137._16_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar184;
      bVar72 = (bool)(bVar70 >> 5 & 1);
      auVar137._20_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar185;
      bVar72 = (bool)(bVar70 >> 6 & 1);
      auVar137._24_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar187;
      auVar137._28_4_ =
           (uint)(bVar70 >> 7) * 0x7f800000 | (uint)!(bool)(bVar70 >> 7) * auVar111._28_4_;
      local_2c0 = vminps_avx(auVar119,auVar137);
      uVar17 = vcmpps_avx512vl(local_520,local_2c0,2);
      bVar62 = bVar62 & 0x7f & (byte)uVar17;
      if (bVar62 == 0) {
        auVar241 = ZEXT3264(CONCAT428(0x7fffffff,
                                      CONCAT424(0x7fffffff,
                                                CONCAT420(0x7fffffff,
                                                          CONCAT416(0x7fffffff,
                                                                    CONCAT412(0x7fffffff,
                                                                              CONCAT48(0x7fffffff,
                                                                                                                                                                              
                                                  0x7fffffff7fffffff)))))));
        auVar259 = ZEXT3264(auVar129);
        goto LAB_01a0ec40;
      }
      auVar111 = vmaxps_avx512vl(auVar120,local_860);
      auVar92 = vfmadd213ps_avx512vl(local_700,auVar125,auVar114);
      fVar166 = auVar93._0_4_;
      fVar178 = auVar93._4_4_;
      auVar40._4_4_ = fVar178 * auVar92._4_4_;
      auVar40._0_4_ = fVar166 * auVar92._0_4_;
      fVar180 = auVar93._8_4_;
      auVar40._8_4_ = fVar180 * auVar92._8_4_;
      fVar182 = auVar93._12_4_;
      auVar40._12_4_ = fVar182 * auVar92._12_4_;
      fVar184 = auVar93._16_4_;
      auVar40._16_4_ = fVar184 * auVar92._16_4_;
      fVar185 = auVar93._20_4_;
      auVar40._20_4_ = fVar185 * auVar92._20_4_;
      fVar187 = auVar93._24_4_;
      auVar40._24_4_ = fVar187 * auVar92._24_4_;
      auVar40._28_4_ = auVar92._28_4_;
      auVar92 = vfmadd213ps_avx512vl(local_5a0,auVar125,auVar114);
      auVar41._4_4_ = fVar178 * auVar92._4_4_;
      auVar41._0_4_ = fVar166 * auVar92._0_4_;
      auVar41._8_4_ = fVar180 * auVar92._8_4_;
      auVar41._12_4_ = fVar182 * auVar92._12_4_;
      auVar41._16_4_ = fVar184 * auVar92._16_4_;
      auVar41._20_4_ = fVar185 * auVar92._20_4_;
      auVar41._24_4_ = fVar187 * auVar92._24_4_;
      auVar41._28_4_ = auVar92._28_4_;
      auVar92 = vminps_avx512vl(auVar40,auVar129);
      auVar47 = ZEXT812(0);
      auVar112 = ZEXT1232(auVar47) << 0x20;
      auVar92 = vmaxps_avx(auVar92,ZEXT1232(auVar47) << 0x20);
      auVar113 = vminps_avx512vl(auVar41,auVar129);
      auVar42._4_4_ = (auVar92._4_4_ + 1.0) * 0.125;
      auVar42._0_4_ = (auVar92._0_4_ + 0.0) * 0.125;
      auVar42._8_4_ = (auVar92._8_4_ + 2.0) * 0.125;
      auVar42._12_4_ = (auVar92._12_4_ + 3.0) * 0.125;
      auVar42._16_4_ = (auVar92._16_4_ + 4.0) * 0.125;
      auVar42._20_4_ = (auVar92._20_4_ + 5.0) * 0.125;
      auVar42._24_4_ = (auVar92._24_4_ + 6.0) * 0.125;
      auVar42._28_4_ = auVar92._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar42,auVar229,auVar221);
      auVar92 = vmaxps_avx(auVar113,ZEXT1232(auVar47) << 0x20);
      auVar43._4_4_ = (auVar92._4_4_ + 1.0) * 0.125;
      auVar43._0_4_ = (auVar92._0_4_ + 0.0) * 0.125;
      auVar43._8_4_ = (auVar92._8_4_ + 2.0) * 0.125;
      auVar43._12_4_ = (auVar92._12_4_ + 3.0) * 0.125;
      auVar43._16_4_ = (auVar92._16_4_ + 4.0) * 0.125;
      auVar43._20_4_ = (auVar92._20_4_ + 5.0) * 0.125;
      auVar43._24_4_ = (auVar92._24_4_ + 6.0) * 0.125;
      auVar43._28_4_ = auVar92._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar43,auVar229,auVar221);
      auVar44._4_4_ = auVar111._4_4_ * auVar111._4_4_;
      auVar44._0_4_ = auVar111._0_4_ * auVar111._0_4_;
      auVar44._8_4_ = auVar111._8_4_ * auVar111._8_4_;
      auVar44._12_4_ = auVar111._12_4_ * auVar111._12_4_;
      auVar44._16_4_ = auVar111._16_4_ * auVar111._16_4_;
      auVar44._20_4_ = auVar111._20_4_ * auVar111._20_4_;
      auVar44._24_4_ = auVar111._24_4_ * auVar111._24_4_;
      auVar44._28_4_ = auVar111._28_4_;
      auVar92 = vsubps_avx(auVar124,auVar44);
      auVar45._4_4_ = auVar92._4_4_ * (float)local_560._4_4_;
      auVar45._0_4_ = auVar92._0_4_ * (float)local_560._0_4_;
      auVar45._8_4_ = auVar92._8_4_ * fStack_558;
      auVar45._12_4_ = auVar92._12_4_ * fStack_554;
      auVar45._16_4_ = auVar92._16_4_ * fStack_550;
      auVar45._20_4_ = auVar92._20_4_ * fStack_54c;
      auVar45._24_4_ = auVar92._24_4_ * fStack_548;
      auVar45._28_4_ = auVar111._28_4_;
      auVar111 = vsubps_avx(local_540,auVar45);
      uVar17 = vcmpps_avx512vl(auVar111,ZEXT1232(auVar47) << 0x20,5);
      bVar70 = (byte)uVar17;
      if (bVar70 == 0) {
        bVar70 = 0;
        auVar93 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar106 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar113 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar115 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar111 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar138._8_4_ = 0x7f800000;
        auVar138._0_8_ = 0x7f8000007f800000;
        auVar138._12_4_ = 0x7f800000;
        auVar138._16_4_ = 0x7f800000;
        auVar138._20_4_ = 0x7f800000;
        auVar138._24_4_ = 0x7f800000;
        auVar138._28_4_ = 0x7f800000;
        auVar139._8_4_ = 0xff800000;
        auVar139._0_8_ = 0xff800000ff800000;
        auVar139._12_4_ = 0xff800000;
        auVar139._16_4_ = 0xff800000;
        auVar139._20_4_ = 0xff800000;
        auVar139._24_4_ = 0xff800000;
        auVar139._28_4_ = 0xff800000;
      }
      else {
        auVar80 = vxorps_avx512vl(auVar86,auVar86);
        uVar75 = vcmpps_avx512vl(auVar111,auVar120,5);
        auVar111 = vsqrtps_avx(auVar111);
        auVar112 = vfnmadd213ps_avx512vl(auVar127,_local_7a0,auVar129);
        auVar115 = vfmadd132ps_avx512vl(auVar112,_local_7a0,_local_7a0);
        auVar112 = vsubps_avx(local_580,auVar111);
        auVar116 = vmulps_avx512vl(auVar112,auVar115);
        auVar111 = vsubps_avx512vl(auVar111,auVar126);
        auVar117 = vmulps_avx512vl(auVar111,auVar115);
        auVar111 = vfmadd213ps_avx512vl(auVar125,auVar116,auVar114);
        auVar46._4_4_ = fVar178 * auVar111._4_4_;
        auVar46._0_4_ = fVar166 * auVar111._0_4_;
        auVar46._8_4_ = fVar180 * auVar111._8_4_;
        auVar46._12_4_ = fVar182 * auVar111._12_4_;
        auVar46._16_4_ = fVar184 * auVar111._16_4_;
        auVar46._20_4_ = fVar185 * auVar111._20_4_;
        auVar46._24_4_ = fVar187 * auVar111._24_4_;
        auVar46._28_4_ = auVar113._28_4_;
        auVar111 = vmulps_avx512vl(local_740,auVar116);
        auVar112 = vmulps_avx512vl(local_420,auVar116);
        auVar119 = vmulps_avx512vl(local_760,auVar116);
        auVar113 = vfmadd213ps_avx512vl(auVar106,auVar46,auVar230);
        auVar113 = vsubps_avx512vl(auVar111,auVar113);
        auVar111 = vfmadd213ps_avx512vl(auVar107,auVar46,auVar109);
        auVar115 = vsubps_avx512vl(auVar112,auVar111);
        auVar77 = vfmadd213ps_fma(auVar46,auVar108,auVar110);
        auVar111 = vsubps_avx(auVar119,ZEXT1632(auVar77));
        auVar112 = vfmadd213ps_avx512vl(auVar125,auVar117,auVar114);
        auVar114 = vmulps_avx512vl(auVar93,auVar112);
        auVar93 = vmulps_avx512vl(local_740,auVar117);
        auVar119 = vmulps_avx512vl(local_420,auVar117);
        auVar120 = vmulps_avx512vl(local_760,auVar117);
        auVar77 = vfmadd213ps_fma(auVar106,auVar114,auVar230);
        auVar112 = vsubps_avx(auVar93,ZEXT1632(auVar77));
        auVar77 = vfmadd213ps_fma(auVar107,auVar114,auVar109);
        auVar93 = vsubps_avx512vl(auVar119,ZEXT1632(auVar77));
        auVar77 = vfmadd213ps_fma(auVar108,auVar114,auVar110);
        auVar106 = vsubps_avx512vl(auVar120,ZEXT1632(auVar77));
        auVar202._8_4_ = 0x7f800000;
        auVar202._0_8_ = 0x7f8000007f800000;
        auVar202._12_4_ = 0x7f800000;
        auVar202._16_4_ = 0x7f800000;
        auVar202._20_4_ = 0x7f800000;
        auVar202._24_4_ = 0x7f800000;
        auVar202._28_4_ = 0x7f800000;
        auVar107 = vblendmps_avx512vl(auVar202,auVar116);
        bVar72 = (bool)((byte)uVar75 & 1);
        auVar138._0_4_ = (uint)bVar72 * auVar107._0_4_ | (uint)!bVar72 * auVar78._0_4_;
        bVar72 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar138._4_4_ = (uint)bVar72 * auVar107._4_4_ | (uint)!bVar72 * auVar78._4_4_;
        bVar72 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar138._8_4_ = (uint)bVar72 * auVar107._8_4_ | (uint)!bVar72 * auVar78._8_4_;
        bVar72 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar138._12_4_ = (uint)bVar72 * auVar107._12_4_ | (uint)!bVar72 * auVar78._12_4_;
        iVar1 = (uint)((byte)(uVar75 >> 4) & 1) * auVar107._16_4_;
        auVar138._16_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar75 >> 5) & 1) * auVar107._20_4_;
        auVar138._20_4_ = iVar2;
        iVar3 = (uint)((byte)(uVar75 >> 6) & 1) * auVar107._24_4_;
        auVar138._24_4_ = iVar3;
        iVar4 = (uint)(byte)(uVar75 >> 7) * auVar107._28_4_;
        auVar138._28_4_ = iVar4;
        auVar203._8_4_ = 0xff800000;
        auVar203._0_8_ = 0xff800000ff800000;
        auVar203._12_4_ = 0xff800000;
        auVar203._16_4_ = 0xff800000;
        auVar203._20_4_ = 0xff800000;
        auVar203._24_4_ = 0xff800000;
        auVar203._28_4_ = 0xff800000;
        auVar107 = vblendmps_avx512vl(auVar203,auVar117);
        bVar72 = (bool)((byte)uVar75 & 1);
        auVar139._0_4_ = (uint)bVar72 * auVar107._0_4_ | (uint)!bVar72 * -0x800000;
        bVar72 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar139._4_4_ = (uint)bVar72 * auVar107._4_4_ | (uint)!bVar72 * -0x800000;
        bVar72 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar139._8_4_ = (uint)bVar72 * auVar107._8_4_ | (uint)!bVar72 * -0x800000;
        bVar72 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar139._12_4_ = (uint)bVar72 * auVar107._12_4_ | (uint)!bVar72 * -0x800000;
        bVar72 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar139._16_4_ = (uint)bVar72 * auVar107._16_4_ | (uint)!bVar72 * -0x800000;
        bVar72 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar139._20_4_ = (uint)bVar72 * auVar107._20_4_ | (uint)!bVar72 * -0x800000;
        bVar72 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar139._24_4_ = (uint)bVar72 * auVar107._24_4_ | (uint)!bVar72 * -0x800000;
        bVar72 = SUB81(uVar75 >> 7,0);
        auVar139._28_4_ = (uint)bVar72 * auVar107._28_4_ | (uint)!bVar72 * -0x800000;
        auVar33._8_4_ = 0x36000000;
        auVar33._0_8_ = 0x3600000036000000;
        auVar33._12_4_ = 0x36000000;
        auVar33._16_4_ = 0x36000000;
        auVar33._20_4_ = 0x36000000;
        auVar33._24_4_ = 0x36000000;
        auVar33._28_4_ = 0x36000000;
        auVar107 = vmulps_avx512vl(local_5c0,auVar33);
        uVar18 = vcmpps_avx512vl(auVar107,local_5e0,0xe);
        uVar75 = uVar75 & uVar18;
        bVar68 = (byte)uVar75;
        if (bVar68 != 0) {
          uVar18 = vcmpps_avx512vl(auVar92,ZEXT1632(auVar80),2);
          auVar247._8_4_ = 0x7f800000;
          auVar247._0_8_ = 0x7f8000007f800000;
          auVar247._12_4_ = 0x7f800000;
          auVar247._16_4_ = 0x7f800000;
          auVar247._20_4_ = 0x7f800000;
          auVar247._24_4_ = 0x7f800000;
          auVar247._28_4_ = 0x7f800000;
          auVar253._8_4_ = 0xff800000;
          auVar253._0_8_ = 0xff800000ff800000;
          auVar253._12_4_ = 0xff800000;
          auVar253._16_4_ = 0xff800000;
          auVar253._20_4_ = 0xff800000;
          auVar253._24_4_ = 0xff800000;
          auVar253._28_4_ = 0xff800000;
          auVar92 = vblendmps_avx512vl(auVar247,auVar253);
          bVar63 = (byte)uVar18;
          uVar76 = (uint)(bVar63 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar107._0_4_;
          bVar72 = (bool)((byte)(uVar18 >> 1) & 1);
          uVar143 = (uint)bVar72 * auVar92._4_4_ | (uint)!bVar72 * auVar107._4_4_;
          bVar72 = (bool)((byte)(uVar18 >> 2) & 1);
          uVar144 = (uint)bVar72 * auVar92._8_4_ | (uint)!bVar72 * auVar107._8_4_;
          bVar72 = (bool)((byte)(uVar18 >> 3) & 1);
          uVar145 = (uint)bVar72 * auVar92._12_4_ | (uint)!bVar72 * auVar107._12_4_;
          bVar72 = (bool)((byte)(uVar18 >> 4) & 1);
          uVar146 = (uint)bVar72 * auVar92._16_4_ | (uint)!bVar72 * auVar107._16_4_;
          bVar72 = (bool)((byte)(uVar18 >> 5) & 1);
          uVar147 = (uint)bVar72 * auVar92._20_4_ | (uint)!bVar72 * auVar107._20_4_;
          bVar72 = (bool)((byte)(uVar18 >> 6) & 1);
          uVar148 = (uint)bVar72 * auVar92._24_4_ | (uint)!bVar72 * auVar107._24_4_;
          bVar72 = SUB81(uVar18 >> 7,0);
          uVar149 = (uint)bVar72 * auVar92._28_4_ | (uint)!bVar72 * auVar107._28_4_;
          auVar138._0_4_ = (bVar68 & 1) * uVar76 | !(bool)(bVar68 & 1) * auVar138._0_4_;
          bVar72 = (bool)((byte)(uVar75 >> 1) & 1);
          auVar138._4_4_ = bVar72 * uVar143 | !bVar72 * auVar138._4_4_;
          bVar72 = (bool)((byte)(uVar75 >> 2) & 1);
          auVar138._8_4_ = bVar72 * uVar144 | !bVar72 * auVar138._8_4_;
          bVar72 = (bool)((byte)(uVar75 >> 3) & 1);
          auVar138._12_4_ = bVar72 * uVar145 | !bVar72 * auVar138._12_4_;
          bVar72 = (bool)((byte)(uVar75 >> 4) & 1);
          auVar138._16_4_ = bVar72 * uVar146 | (uint)!bVar72 * iVar1;
          bVar72 = (bool)((byte)(uVar75 >> 5) & 1);
          auVar138._20_4_ = bVar72 * uVar147 | (uint)!bVar72 * iVar2;
          bVar72 = (bool)((byte)(uVar75 >> 6) & 1);
          auVar138._24_4_ = bVar72 * uVar148 | (uint)!bVar72 * iVar3;
          bVar72 = SUB81(uVar75 >> 7,0);
          auVar138._28_4_ = bVar72 * uVar149 | (uint)!bVar72 * iVar4;
          auVar92 = vblendmps_avx512vl(auVar253,auVar247);
          bVar72 = (bool)((byte)(uVar18 >> 1) & 1);
          bVar10 = (bool)((byte)(uVar18 >> 2) & 1);
          bVar11 = (bool)((byte)(uVar18 >> 3) & 1);
          bVar12 = (bool)((byte)(uVar18 >> 4) & 1);
          bVar13 = (bool)((byte)(uVar18 >> 5) & 1);
          bVar14 = (bool)((byte)(uVar18 >> 6) & 1);
          bVar15 = SUB81(uVar18 >> 7,0);
          auVar139._0_4_ =
               (uint)(bVar68 & 1) *
               ((uint)(bVar63 & 1) * auVar92._0_4_ | !(bool)(bVar63 & 1) * uVar76) |
               !(bool)(bVar68 & 1) * auVar139._0_4_;
          bVar9 = (bool)((byte)(uVar75 >> 1) & 1);
          auVar139._4_4_ =
               (uint)bVar9 * ((uint)bVar72 * auVar92._4_4_ | !bVar72 * uVar143) |
               !bVar9 * auVar139._4_4_;
          bVar72 = (bool)((byte)(uVar75 >> 2) & 1);
          auVar139._8_4_ =
               (uint)bVar72 * ((uint)bVar10 * auVar92._8_4_ | !bVar10 * uVar144) |
               !bVar72 * auVar139._8_4_;
          bVar72 = (bool)((byte)(uVar75 >> 3) & 1);
          auVar139._12_4_ =
               (uint)bVar72 * ((uint)bVar11 * auVar92._12_4_ | !bVar11 * uVar145) |
               !bVar72 * auVar139._12_4_;
          bVar72 = (bool)((byte)(uVar75 >> 4) & 1);
          auVar139._16_4_ =
               (uint)bVar72 * ((uint)bVar12 * auVar92._16_4_ | !bVar12 * uVar146) |
               !bVar72 * auVar139._16_4_;
          bVar72 = (bool)((byte)(uVar75 >> 5) & 1);
          auVar139._20_4_ =
               (uint)bVar72 * ((uint)bVar13 * auVar92._20_4_ | !bVar13 * uVar147) |
               !bVar72 * auVar139._20_4_;
          bVar72 = (bool)((byte)(uVar75 >> 6) & 1);
          auVar139._24_4_ =
               (uint)bVar72 * ((uint)bVar14 * auVar92._24_4_ | !bVar14 * uVar148) |
               !bVar72 * auVar139._24_4_;
          bVar72 = SUB81(uVar75 >> 7,0);
          auVar139._28_4_ =
               (uint)bVar72 * ((uint)bVar15 * auVar92._28_4_ | !bVar15 * uVar149) |
               !bVar72 * auVar139._28_4_;
          bVar70 = (~bVar68 | bVar63) & bVar70;
        }
      }
      auVar257 = ZEXT3264(local_760);
      auVar92 = vmulps_avx512vl(local_760,auVar106);
      auVar92 = vfmadd231ps_avx512vl(auVar92,local_420,auVar93);
      auVar256 = ZEXT3264(local_740);
      auVar92 = vfmadd231ps_avx512vl(auVar92,local_740,auVar112);
      _local_200 = local_520;
      local_1e0 = vminps_avx(local_2c0,auVar138);
      auVar244._8_4_ = 0x7fffffff;
      auVar244._0_8_ = 0x7fffffff7fffffff;
      auVar244._12_4_ = 0x7fffffff;
      auVar244._16_4_ = 0x7fffffff;
      auVar244._20_4_ = 0x7fffffff;
      auVar244._24_4_ = 0x7fffffff;
      auVar244._28_4_ = 0x7fffffff;
      auVar92 = vandps_avx(auVar92,auVar244);
      auVar241 = ZEXT3264(auVar244);
      _local_500 = vmaxps_avx(local_520,auVar139);
      _local_2e0 = _local_500;
      auVar245._8_4_ = 0x3e99999a;
      auVar245._0_8_ = 0x3e99999a3e99999a;
      auVar245._12_4_ = 0x3e99999a;
      auVar245._16_4_ = 0x3e99999a;
      auVar245._20_4_ = 0x3e99999a;
      auVar245._24_4_ = 0x3e99999a;
      auVar245._28_4_ = 0x3e99999a;
      uVar17 = vcmpps_avx512vl(auVar92,auVar245,1);
      uVar20 = vcmpps_avx512vl(local_520,local_1e0,2);
      bVar68 = (byte)uVar20 & bVar62;
      uVar19 = vcmpps_avx512vl(_local_500,local_2c0,2);
      if ((bVar62 & ((byte)uVar19 | (byte)uVar20)) == 0) {
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar259 = ZEXT3264(auVar92);
        auVar249 = ZEXT3264(local_800);
        auVar250 = ZEXT3264(local_820);
        auVar246 = ZEXT3264(local_7c0);
        auVar248 = ZEXT3264(local_7e0);
      }
      else {
        bVar63 = (byte)uVar17 | ~bVar70;
        auVar92 = vmulps_avx512vl(local_760,auVar111);
        auVar77 = vfmadd213ps_fma(auVar115,local_420,auVar92);
        auVar92 = vfmadd213ps_avx512vl(auVar113,local_740,ZEXT1632(auVar77));
        auVar92 = vandps_avx(auVar92,auVar244);
        uVar17 = vcmpps_avx512vl(auVar92,auVar245,1);
        bVar70 = (byte)uVar17 | ~bVar70;
        auVar159._8_4_ = 2;
        auVar159._0_8_ = 0x200000002;
        auVar159._12_4_ = 2;
        auVar159._16_4_ = 2;
        auVar159._20_4_ = 2;
        auVar159._24_4_ = 2;
        auVar159._28_4_ = 2;
        auVar34._8_4_ = 3;
        auVar34._0_8_ = 0x300000003;
        auVar34._12_4_ = 3;
        auVar34._16_4_ = 3;
        auVar34._20_4_ = 3;
        auVar34._24_4_ = 3;
        auVar34._28_4_ = 3;
        auVar92 = vpblendmd_avx512vl(auVar159,auVar34);
        local_2a0._0_4_ = (uint)(bVar70 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar70 & 1) * 2;
        bVar72 = (bool)(bVar70 >> 1 & 1);
        local_2a0._4_4_ = (uint)bVar72 * auVar92._4_4_ | (uint)!bVar72 * 2;
        bVar72 = (bool)(bVar70 >> 2 & 1);
        local_2a0._8_4_ = (uint)bVar72 * auVar92._8_4_ | (uint)!bVar72 * 2;
        bVar72 = (bool)(bVar70 >> 3 & 1);
        local_2a0._12_4_ = (uint)bVar72 * auVar92._12_4_ | (uint)!bVar72 * 2;
        bVar72 = (bool)(bVar70 >> 4 & 1);
        local_2a0._16_4_ = (uint)bVar72 * auVar92._16_4_ | (uint)!bVar72 * 2;
        bVar72 = (bool)(bVar70 >> 5 & 1);
        local_2a0._20_4_ = (uint)bVar72 * auVar92._20_4_ | (uint)!bVar72 * 2;
        bVar72 = (bool)(bVar70 >> 6 & 1);
        local_2a0._24_4_ = (uint)bVar72 * auVar92._24_4_ | (uint)!bVar72 * 2;
        local_2a0._28_4_ = (uint)(bVar70 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar70 >> 7) * 2;
        local_480 = vpbroadcastd_avx512vl();
        uVar17 = vpcmpd_avx512vl(local_480,local_2a0,5);
        local_4e0 = local_520._0_4_ + (float)local_720._0_4_;
        fStack_4dc = local_520._4_4_ + (float)local_720._4_4_;
        fStack_4d8 = local_520._8_4_ + fStack_718;
        fStack_4d4 = local_520._12_4_ + fStack_714;
        fStack_4d0 = local_520._16_4_ + fStack_710;
        fStack_4cc = local_520._20_4_ + fStack_70c;
        fStack_4c8 = local_520._24_4_ + fStack_708;
        fStack_4c4 = local_520._28_4_ + fStack_704;
        for (bVar70 = (byte)uVar17 & bVar68; bVar70 != 0;
            bVar70 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar70 & (byte)uVar17) {
          auVar160._8_4_ = 0x7f800000;
          auVar160._0_8_ = 0x7f8000007f800000;
          auVar160._12_4_ = 0x7f800000;
          auVar160._16_4_ = 0x7f800000;
          auVar160._20_4_ = 0x7f800000;
          auVar160._24_4_ = 0x7f800000;
          auVar160._28_4_ = 0x7f800000;
          auVar92 = vblendmps_avx512vl(auVar160,local_520);
          auVar141._0_4_ =
               (uint)(bVar70 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar70 & 1) * 0x7f800000;
          bVar72 = (bool)(bVar70 >> 1 & 1);
          auVar141._4_4_ = (uint)bVar72 * auVar92._4_4_ | (uint)!bVar72 * 0x7f800000;
          bVar72 = (bool)(bVar70 >> 2 & 1);
          auVar141._8_4_ = (uint)bVar72 * auVar92._8_4_ | (uint)!bVar72 * 0x7f800000;
          bVar72 = (bool)(bVar70 >> 3 & 1);
          auVar141._12_4_ = (uint)bVar72 * auVar92._12_4_ | (uint)!bVar72 * 0x7f800000;
          bVar72 = (bool)(bVar70 >> 4 & 1);
          auVar141._16_4_ = (uint)bVar72 * auVar92._16_4_ | (uint)!bVar72 * 0x7f800000;
          bVar72 = (bool)(bVar70 >> 5 & 1);
          auVar141._20_4_ = (uint)bVar72 * auVar92._20_4_ | (uint)!bVar72 * 0x7f800000;
          auVar141._24_4_ =
               (uint)(bVar70 >> 6) * auVar92._24_4_ | (uint)!(bool)(bVar70 >> 6) * 0x7f800000;
          auVar141._28_4_ = 0x7f800000;
          auVar92 = vshufps_avx(auVar141,auVar141,0xb1);
          auVar92 = vminps_avx(auVar141,auVar92);
          auVar93 = vshufpd_avx(auVar92,auVar92,5);
          auVar92 = vminps_avx(auVar92,auVar93);
          auVar93 = vpermpd_avx2(auVar92,0x4e);
          auVar92 = vminps_avx(auVar92,auVar93);
          uVar17 = vcmpps_avx512vl(auVar141,auVar92,0);
          bVar64 = (byte)uVar17 & bVar70;
          bVar65 = bVar70;
          if (bVar64 != 0) {
            bVar65 = bVar64;
          }
          iVar2 = 0;
          for (uVar76 = (uint)bVar65; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
            iVar2 = iVar2 + 1;
          }
          uVar76 = *(uint *)(local_1a0 + (uint)(iVar2 << 2));
          fVar165 = auVar16._0_4_;
          auVar77 = ZEXT416(*(uint *)(local_200 + (uint)(iVar2 << 2)));
          if ((float)local_780._0_4_ < 0.0) {
            local_860._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar2 << 2)));
            fVar165 = sqrtf((float)local_780._0_4_);
            auVar77 = local_860._0_16_;
          }
          auVar81 = vminps_avx(local_600._0_16_,local_640._0_16_);
          auVar80 = vmaxps_avx(local_600._0_16_,local_640._0_16_);
          auVar82 = vminps_avx(local_620._0_16_,local_660._0_16_);
          auVar89 = vminps_avx(auVar81,auVar82);
          auVar81 = vmaxps_avx(local_620._0_16_,local_660._0_16_);
          auVar82 = vmaxps_avx(auVar80,auVar81);
          auVar207._8_4_ = 0x7fffffff;
          auVar207._0_8_ = 0x7fffffff7fffffff;
          auVar207._12_4_ = 0x7fffffff;
          auVar80 = vandps_avx(auVar89,auVar207);
          auVar81 = vandps_avx(auVar82,auVar207);
          auVar80 = vmaxps_avx(auVar80,auVar81);
          auVar81 = vmovshdup_avx(auVar80);
          auVar81 = vmaxss_avx(auVar81,auVar80);
          auVar80 = vshufpd_avx(auVar80,auVar80,1);
          auVar80 = vmaxss_avx(auVar80,auVar81);
          fVar177 = auVar80._0_4_ * 1.9073486e-06;
          local_6a0 = vshufps_avx(auVar82,auVar82,0xff);
          auVar77 = vinsertps_avx(auVar77,ZEXT416(uVar76),0x10);
          auVar241 = ZEXT1664(auVar77);
          lVar69 = 5;
          do {
            do {
              bVar72 = lVar69 == 0;
              lVar69 = lVar69 + -1;
              if (bVar72) goto LAB_01a0f83a;
              fVar186 = auVar241._0_4_;
              auVar152._4_4_ = fVar186;
              auVar152._0_4_ = fVar186;
              auVar152._8_4_ = fVar186;
              auVar152._12_4_ = fVar186;
              auVar80 = vfmadd132ps_fma(auVar152,ZEXT816(0) << 0x40,local_770);
              auVar89 = auVar241._0_16_;
              auVar77 = vmovshdup_avx(auVar89);
              local_580._0_16_ = auVar77;
              fVar206 = 1.0 - auVar77._0_4_;
              auVar77 = vshufps_avx(auVar89,auVar89,0x55);
              fVar179 = auVar77._0_4_;
              auVar188._0_4_ = local_640._0_4_ * fVar179;
              fVar181 = auVar77._4_4_;
              auVar188._4_4_ = local_640._4_4_ * fVar181;
              fVar164 = auVar77._8_4_;
              auVar188._8_4_ = local_640._8_4_ * fVar164;
              fVar183 = auVar77._12_4_;
              auVar188._12_4_ = local_640._12_4_ * fVar183;
              _local_560 = ZEXT416((uint)fVar206);
              auVar208._4_4_ = fVar206;
              auVar208._0_4_ = fVar206;
              auVar208._8_4_ = fVar206;
              auVar208._12_4_ = fVar206;
              auVar77 = vfmadd231ps_fma(auVar188,auVar208,local_600._0_16_);
              auVar225._0_4_ = local_620._0_4_ * fVar179;
              auVar225._4_4_ = local_620._4_4_ * fVar181;
              auVar225._8_4_ = local_620._8_4_ * fVar164;
              auVar225._12_4_ = local_620._12_4_ * fVar183;
              auVar81 = vfmadd231ps_fma(auVar225,auVar208,local_640._0_16_);
              auVar233._0_4_ = fVar179 * (float)local_660._0_4_;
              auVar233._4_4_ = fVar181 * (float)local_660._4_4_;
              auVar233._8_4_ = fVar164 * fStack_658;
              auVar233._12_4_ = fVar183 * fStack_654;
              auVar82 = vfmadd231ps_fma(auVar233,auVar208,local_620._0_16_);
              auVar239._0_4_ = fVar179 * auVar81._0_4_;
              auVar239._4_4_ = fVar181 * auVar81._4_4_;
              auVar239._8_4_ = fVar164 * auVar81._8_4_;
              auVar239._12_4_ = fVar183 * auVar81._12_4_;
              auVar77 = vfmadd231ps_fma(auVar239,auVar208,auVar77);
              auVar189._0_4_ = fVar179 * auVar82._0_4_;
              auVar189._4_4_ = fVar181 * auVar82._4_4_;
              auVar189._8_4_ = fVar164 * auVar82._8_4_;
              auVar189._12_4_ = fVar183 * auVar82._12_4_;
              auVar81 = vfmadd231ps_fma(auVar189,auVar208,auVar81);
              auVar226._0_4_ = fVar179 * auVar81._0_4_;
              auVar226._4_4_ = fVar181 * auVar81._4_4_;
              auVar226._8_4_ = fVar164 * auVar81._8_4_;
              auVar226._12_4_ = fVar183 * auVar81._12_4_;
              auVar82 = vfmadd231ps_fma(auVar226,auVar77,auVar208);
              auVar77 = vsubps_avx(auVar81,auVar77);
              auVar21._8_4_ = 0x40400000;
              auVar21._0_8_ = 0x4040000040400000;
              auVar21._12_4_ = 0x40400000;
              auVar81 = vmulps_avx512vl(auVar77,auVar21);
              local_540._0_16_ = auVar82;
              auVar80 = vsubps_avx(auVar80,auVar82);
              auVar77 = vdpps_avx(auVar80,auVar80,0x7f);
              local_860._0_16_ = auVar77;
              if (auVar77._0_4_ < 0.0) {
                auVar249._0_4_ = sqrtf(auVar77._0_4_);
                auVar249._4_60_ = extraout_var;
                auVar77 = auVar249._0_16_;
              }
              else {
                auVar77 = vsqrtss_avx(auVar77,auVar77);
              }
              local_5a0._0_16_ = vdpps_avx(auVar81,auVar81,0x7f);
              fVar179 = local_5a0._0_4_;
              auVar190._4_12_ = ZEXT812(0) << 0x20;
              auVar190._0_4_ = fVar179;
              _local_7a0 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar190);
              fVar181 = local_7a0._0_4_;
              local_5c0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar190);
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar78 = vxorps_avx512vl(local_5a0._0_16_,auVar22);
              auVar82 = vfnmadd213ss_fma(local_5c0._0_16_,local_5a0._0_16_,ZEXT416(0x40000000));
              local_5e0._0_4_ = auVar82._0_4_;
              local_700._0_4_ = auVar77._0_4_;
              if (fVar179 < auVar78._0_4_) {
                auVar250._0_4_ = sqrtf(fVar179);
                auVar250._4_60_ = extraout_var_00;
                auVar77 = ZEXT416((uint)local_700._0_4_);
                auVar82 = auVar250._0_16_;
              }
              else {
                auVar82 = vsqrtss_avx512f(local_5a0._0_16_,local_5a0._0_16_);
              }
              fVar164 = local_7a0._0_4_;
              fVar179 = fVar181 * 1.5 + fVar179 * -0.5 * fVar164 * fVar164 * fVar164;
              local_7a0._0_4_ = auVar81._0_4_ * fVar179;
              local_7a0._4_4_ = auVar81._4_4_ * fVar179;
              fStack_798 = auVar81._8_4_ * fVar179;
              fStack_794 = auVar81._12_4_ * fVar179;
              auVar78 = vdpps_avx(auVar80,_local_7a0,0x7f);
              fVar164 = auVar77._0_4_;
              auVar153._0_4_ = auVar78._0_4_ * auVar78._0_4_;
              auVar153._4_4_ = auVar78._4_4_ * auVar78._4_4_;
              auVar153._8_4_ = auVar78._8_4_ * auVar78._8_4_;
              auVar153._12_4_ = auVar78._12_4_ * auVar78._12_4_;
              auVar88 = vsubps_avx(local_860._0_16_,auVar153);
              fVar181 = auVar88._0_4_;
              auVar167._4_12_ = ZEXT812(0) << 0x20;
              auVar167._0_4_ = fVar181;
              auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar167);
              auVar84 = vmulss_avx512f(auVar83,ZEXT416(0x3fc00000));
              auVar85 = vmulss_avx512f(auVar88,ZEXT416(0xbf000000));
              if (fVar181 < 0.0) {
                local_680._0_4_ = auVar85._0_4_;
                local_690 = fVar179;
                fStack_68c = fVar179;
                fStack_688 = fVar179;
                fStack_684 = fVar179;
                local_670 = auVar83;
                fVar181 = sqrtf(fVar181);
                auVar85 = ZEXT416((uint)local_680._0_4_);
                auVar84 = ZEXT416(auVar84._0_4_);
                auVar82 = ZEXT416(auVar82._0_4_);
                auVar77 = ZEXT416((uint)local_700._0_4_);
                auVar83 = local_670;
                fVar179 = local_690;
                fVar183 = fStack_68c;
                fVar206 = fStack_688;
                fVar166 = fStack_684;
              }
              else {
                auVar88 = vsqrtss_avx(auVar88,auVar88);
                fVar181 = auVar88._0_4_;
                fVar183 = fVar179;
                fVar206 = fVar179;
                fVar166 = fVar179;
              }
              auVar90 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_560,local_580._0_16_);
              auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_580._0_16_,_local_560);
              fVar178 = auVar88._0_4_ * 6.0;
              fVar180 = local_580._0_4_ * 6.0;
              auVar209._0_4_ = fVar180 * (float)local_660._0_4_;
              auVar209._4_4_ = fVar180 * (float)local_660._4_4_;
              auVar209._8_4_ = fVar180 * fStack_658;
              auVar209._12_4_ = fVar180 * fStack_654;
              auVar191._4_4_ = fVar178;
              auVar191._0_4_ = fVar178;
              auVar191._8_4_ = fVar178;
              auVar191._12_4_ = fVar178;
              auVar88 = vfmadd132ps_fma(auVar191,auVar209,local_620._0_16_);
              fVar178 = auVar90._0_4_ * 6.0;
              auVar168._4_4_ = fVar178;
              auVar168._0_4_ = fVar178;
              auVar168._8_4_ = fVar178;
              auVar168._12_4_ = fVar178;
              auVar88 = vfmadd132ps_fma(auVar168,auVar88,local_640._0_16_);
              fVar178 = local_560._0_4_ * 6.0;
              auVar192._4_4_ = fVar178;
              auVar192._0_4_ = fVar178;
              auVar192._8_4_ = fVar178;
              auVar192._12_4_ = fVar178;
              auVar88 = vfmadd132ps_fma(auVar192,auVar88,local_600._0_16_);
              auVar169._0_4_ = auVar88._0_4_ * (float)local_5a0._0_4_;
              auVar169._4_4_ = auVar88._4_4_ * (float)local_5a0._0_4_;
              auVar169._8_4_ = auVar88._8_4_ * (float)local_5a0._0_4_;
              auVar169._12_4_ = auVar88._12_4_ * (float)local_5a0._0_4_;
              auVar88 = vdpps_avx(auVar81,auVar88,0x7f);
              fVar178 = auVar88._0_4_;
              auVar193._0_4_ = auVar81._0_4_ * fVar178;
              auVar193._4_4_ = auVar81._4_4_ * fVar178;
              auVar193._8_4_ = auVar81._8_4_ * fVar178;
              auVar193._12_4_ = auVar81._12_4_ * fVar178;
              auVar88 = vsubps_avx(auVar169,auVar193);
              fVar178 = (float)local_5e0._0_4_ * (float)local_5c0._0_4_;
              auVar90 = vmaxss_avx(ZEXT416((uint)fVar177),
                                   ZEXT416((uint)(fVar186 * fVar165 * 1.9073486e-06)));
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar86 = vxorps_avx512vl(auVar81,auVar23);
              auVar194._0_4_ = fVar179 * auVar88._0_4_ * fVar178;
              auVar194._4_4_ = fVar183 * auVar88._4_4_ * fVar178;
              auVar194._8_4_ = fVar206 * auVar88._8_4_ * fVar178;
              auVar194._12_4_ = fVar166 * auVar88._12_4_ * fVar178;
              auVar88 = vdpps_avx(auVar86,_local_7a0,0x7f);
              auVar87 = vdivss_avx512f(ZEXT416((uint)fVar177),auVar82);
              auVar82 = vfmadd213ss_fma(auVar77,ZEXT416((uint)fVar177),auVar90);
              auVar77 = vdpps_avx(auVar80,auVar194,0x7f);
              auVar87 = vfmadd213ss_fma(ZEXT416((uint)(fVar164 + 1.0)),auVar87,auVar82);
              fVar179 = auVar88._0_4_ + auVar77._0_4_;
              auVar77 = vdpps_avx(local_770,_local_7a0,0x7f);
              auVar82 = vdpps_avx(auVar80,auVar86,0x7f);
              auVar88 = vmulss_avx512f(auVar85,auVar83);
              auVar83 = vmulss_avx512f(auVar83,auVar83);
              auVar85 = vaddss_avx512f(auVar84,ZEXT416((uint)(auVar88._0_4_ * auVar83._0_4_)));
              auVar88 = vdpps_avx(auVar80,local_770,0x7f);
              auVar84 = vfnmadd231ss_fma(auVar82,auVar78,ZEXT416((uint)fVar179));
              auVar88 = vfnmadd231ss_fma(auVar88,auVar78,auVar77);
              auVar82 = vpermilps_avx(local_540._0_16_,0xff);
              fVar181 = fVar181 - auVar82._0_4_;
              auVar83 = vshufps_avx(auVar81,auVar81,0xff);
              auVar82 = vfmsub213ss_fma(auVar84,auVar85,auVar83);
              auVar242._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
              auVar242._8_4_ = auVar82._8_4_ ^ 0x80000000;
              auVar242._12_4_ = auVar82._12_4_ ^ 0x80000000;
              auVar88 = ZEXT416((uint)(auVar88._0_4_ * auVar85._0_4_));
              auVar84 = vfmsub231ss_fma(ZEXT416((uint)(auVar77._0_4_ * auVar82._0_4_)),
                                        ZEXT416((uint)fVar179),auVar88);
              auVar82 = vinsertps_avx(auVar242,auVar88,0x1c);
              auVar234._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
              auVar234._8_4_ = auVar77._8_4_ ^ 0x80000000;
              auVar234._12_4_ = auVar77._12_4_ ^ 0x80000000;
              auVar88 = vinsertps_avx(ZEXT416((uint)fVar179),auVar234,0x10);
              auVar210._0_4_ = auVar84._0_4_;
              auVar210._4_4_ = auVar210._0_4_;
              auVar210._8_4_ = auVar210._0_4_;
              auVar210._12_4_ = auVar210._0_4_;
              auVar77 = vdivps_avx(auVar82,auVar210);
              auVar82 = vdivps_avx(auVar88,auVar210);
              auVar88 = vbroadcastss_avx512vl(auVar78);
              auVar211._0_4_ = auVar88._0_4_ * auVar77._0_4_ + fVar181 * auVar82._0_4_;
              auVar211._4_4_ = auVar88._4_4_ * auVar77._4_4_ + fVar181 * auVar82._4_4_;
              auVar211._8_4_ = auVar88._8_4_ * auVar77._8_4_ + fVar181 * auVar82._8_4_;
              auVar211._12_4_ = auVar88._12_4_ * auVar77._12_4_ + fVar181 * auVar82._12_4_;
              auVar77 = vsubps_avx(auVar89,auVar211);
              auVar241 = ZEXT1664(auVar77);
              auVar24._8_4_ = 0x7fffffff;
              auVar24._0_8_ = 0x7fffffff7fffffff;
              auVar24._12_4_ = 0x7fffffff;
              auVar82 = vandps_avx512vl(auVar78,auVar24);
            } while (auVar87._0_4_ <= auVar82._0_4_);
            auVar82 = vfmadd231ss_fma(ZEXT416((uint)(auVar87._0_4_ + auVar90._0_4_)),local_6a0,
                                      ZEXT416(0x36000000));
            auVar25._8_4_ = 0x7fffffff;
            auVar25._0_8_ = 0x7fffffff7fffffff;
            auVar25._12_4_ = 0x7fffffff;
            auVar89 = vandps_avx512vl(ZEXT416((uint)fVar181),auVar25);
          } while (auVar82._0_4_ <= auVar89._0_4_);
          fVar165 = auVar77._0_4_ + (float)local_6b0._0_4_;
          if ((fVar6 <= fVar165) &&
             (fVar177 = pre->ray_space[4].vz.field_0.m128[(long)ray], fVar165 <= fVar177)) {
            auVar82 = vmovshdup_avx(auVar77);
            fVar179 = auVar82._0_4_;
            if ((0.0 <= fVar179) && (fVar179 <= 1.0)) {
              auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_860._0_4_));
              fVar181 = auVar82._0_4_;
              lVar69 = *(long *)(*(long *)(*(long *)k + 0x1e8) + uVar66 * 8);
              if ((*(uint *)(lVar69 + 0x34) & (uint)pre->ray_space[5].vy.field_0.m128[(long)ray]) !=
                  0) {
                fVar181 = fVar181 * 1.5 + local_860._0_4_ * -0.5 * fVar181 * fVar181 * fVar181;
                auVar212._0_4_ = auVar80._0_4_ * fVar181;
                auVar212._4_4_ = auVar80._4_4_ * fVar181;
                auVar212._8_4_ = auVar80._8_4_ * fVar181;
                auVar212._12_4_ = auVar80._12_4_ * fVar181;
                auVar89 = vfmadd213ps_fma(auVar83,auVar212,auVar81);
                auVar80 = vshufps_avx(auVar212,auVar212,0xc9);
                auVar82 = vshufps_avx(auVar81,auVar81,0xc9);
                auVar213._0_4_ = auVar212._0_4_ * auVar82._0_4_;
                auVar213._4_4_ = auVar212._4_4_ * auVar82._4_4_;
                auVar213._8_4_ = auVar212._8_4_ * auVar82._8_4_;
                auVar213._12_4_ = auVar212._12_4_ * auVar82._12_4_;
                auVar82 = vfmsub231ps_fma(auVar213,auVar81,auVar80);
                auVar80 = vshufps_avx(auVar82,auVar82,0xc9);
                auVar81 = vshufps_avx(auVar89,auVar89,0xc9);
                auVar82 = vshufps_avx(auVar82,auVar82,0xd2);
                auVar154._0_4_ = auVar89._0_4_ * auVar82._0_4_;
                auVar154._4_4_ = auVar89._4_4_ * auVar82._4_4_;
                auVar154._8_4_ = auVar89._8_4_ * auVar82._8_4_;
                auVar154._12_4_ = auVar89._12_4_ * auVar82._12_4_;
                auVar80 = vfmsub231ps_fma(auVar154,auVar80,auVar81);
                fVar181 = auVar80._0_4_;
                if ((*(long *)(*(long *)(k + 0x10) + 0x10) == 0) && (*(long *)(lVar69 + 0x40) == 0))
                {
                  pre->ray_space[4].vz.field_0.m128[(long)ray] = fVar165;
                  fVar165 = (float)vextractps_avx(auVar80,1);
                  pre->ray_space[7].vy.field_0.m128[(long)ray] = fVar165;
                  uVar151 = vextractps_avx(auVar80,2);
                  *(undefined4 *)((long)pre[1].ray_space + (long)ray * 4 + -0x20) = uVar151;
                  pre[1].ray_space[0].vx.field_0.m128[(long)ray] = fVar181;
                  pre[1].ray_space[0].vz.field_0.m128[(long)ray] = fVar179;
                  pre[1].ray_space[1].vy.field_0.m128[(long)ray] = 0.0;
                  pre[1].ray_space[2].vx.field_0.m128[(long)ray] = (float)local_828;
                  pre[1].ray_space[2].vz.field_0.m128[(long)ray] = fVar150;
                  pre[1].ray_space[3].vy.field_0.m128[(long)ray] = **(float **)(k + 8);
                  pre[1].ray_space[4].vx.field_0.m128[(long)ray] = *(float *)(*(long *)(k + 8) + 4);
                }
                else {
                  puVar7 = *(undefined4 **)(k + 8);
                  auVar222._8_4_ = 1;
                  auVar222._0_8_ = 0x100000001;
                  auVar222._12_4_ = 1;
                  auVar222._16_4_ = 1;
                  auVar222._20_4_ = 1;
                  auVar222._24_4_ = 1;
                  auVar222._28_4_ = 1;
                  local_3a0 = vpermps_avx2(auVar222,ZEXT1632(auVar77));
                  local_400 = vpermps_avx2(auVar222,ZEXT1632(auVar80));
                  auVar231._8_4_ = 2;
                  auVar231._0_8_ = 0x200000002;
                  auVar231._12_4_ = 2;
                  auVar231._16_4_ = 2;
                  auVar231._20_4_ = 2;
                  auVar231._24_4_ = 2;
                  auVar231._28_4_ = 2;
                  local_3e0 = vpermps_avx2(auVar231,ZEXT1632(auVar80));
                  local_3c0 = fVar181;
                  fStack_3bc = fVar181;
                  fStack_3b8 = fVar181;
                  fStack_3b4 = fVar181;
                  fStack_3b0 = fVar181;
                  fStack_3ac = fVar181;
                  fStack_3a8 = fVar181;
                  fStack_3a4 = fVar181;
                  local_380 = ZEXT432(0) << 0x20;
                  local_360 = local_460._0_8_;
                  uStack_358 = local_460._8_8_;
                  uStack_350 = local_460._16_8_;
                  uStack_348 = local_460._24_8_;
                  local_340 = local_440;
                  auVar92 = vpcmpeqd_avx2(local_440,local_440);
                  local_840[1] = auVar92;
                  *local_840 = auVar92;
                  local_320._0_4_ = *puVar7;
                  local_320._4_4_ = local_320._0_4_;
                  local_320._8_4_ = local_320._0_4_;
                  local_320._12_4_ = local_320._0_4_;
                  local_320._16_4_ = local_320._0_4_;
                  local_320._20_4_ = local_320._0_4_;
                  local_320._24_4_ = local_320._0_4_;
                  local_320._28_4_ = local_320._0_4_;
                  local_300 = puVar7[1];
                  uStack_2fc = local_300;
                  uStack_2f8 = local_300;
                  uStack_2f4 = local_300;
                  uStack_2f0 = local_300;
                  uStack_2ec = local_300;
                  uStack_2e8 = local_300;
                  uStack_2e4 = local_300;
                  pre->ray_space[4].vz.field_0.m128[(long)ray] = fVar165;
                  local_6e0 = local_4a0;
                  local_890 = local_6e0;
                  local_888 = *(undefined8 *)(lVar69 + 0x18);
                  local_880 = *(undefined8 *)(k + 8);
                  local_870 = (int *)local_400;
                  local_868 = 8;
                  local_878 = pre;
                  if (*(code **)(lVar69 + 0x40) != (code *)0x0) {
                    (**(code **)(lVar69 + 0x40))(&local_890);
                  }
                  if (local_6e0 != (undefined1  [32])0x0) {
                    pcVar8 = *(code **)(*(byte **)(k + 0x10) + 0x10);
                    if ((pcVar8 != (code *)0x0) &&
                       (((**(byte **)(k + 0x10) & 2) != 0 ||
                        ((*(byte *)(lVar69 + 0x3e) & 0x40) != 0)))) {
                      (*pcVar8)(&local_890);
                    }
                    if (local_6e0 != (undefined1  [32])0x0) {
                      uVar75 = vptestmd_avx512vl(local_6e0,local_6e0);
                      iVar3 = local_870[1];
                      iVar4 = local_870[2];
                      iVar1 = local_870[3];
                      iVar48 = local_870[4];
                      iVar49 = local_870[5];
                      iVar50 = local_870[6];
                      iVar51 = local_870[7];
                      pVVar5 = &local_878->ray_space[7].vy;
                      iVar52 = *(int *)((long)&local_878->ray_space[7].vy.field_0 + 4);
                      iVar53 = *(int *)((long)&local_878->ray_space[7].vy.field_0 + 8);
                      iVar54 = *(int *)((long)&local_878->ray_space[7].vy.field_0 + 0xc);
                      iVar55 = *(int *)&local_878->ray_space[7].vz.field_0;
                      iVar56 = *(int *)((long)&local_878->ray_space[7].vz.field_0 + 4);
                      iVar57 = *(int *)((long)&local_878->ray_space[7].vz.field_0 + 8);
                      iVar58 = *(int *)((long)&local_878->ray_space[7].vz.field_0 + 0xc);
                      bVar65 = (byte)uVar75;
                      bVar72 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar75 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar75 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar75 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 6) & 1);
                      bVar14 = SUB81(uVar75 >> 7,0);
                      (pVVar5->field_0).m128[0] =
                           (float)((uint)(bVar65 & 1) * *local_870 |
                                  (uint)!(bool)(bVar65 & 1) * *(int *)&pVVar5->field_0);
                      local_878->ray_space[7].vy.field_0.m128[1] =
                           (float)((uint)bVar72 * iVar3 | (uint)!bVar72 * iVar52);
                      local_878->ray_space[7].vy.field_0.m128[2] =
                           (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar53);
                      local_878->ray_space[7].vy.field_0.m128[3] =
                           (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar54);
                      local_878->ray_space[7].vz.field_0.m128[0] =
                           (float)((uint)bVar11 * iVar48 | (uint)!bVar11 * iVar55);
                      local_878->ray_space[7].vz.field_0.m128[1] =
                           (float)((uint)bVar12 * iVar49 | (uint)!bVar12 * iVar56);
                      local_878->ray_space[7].vz.field_0.m128[2] =
                           (float)((uint)bVar13 * iVar50 | (uint)!bVar13 * iVar57);
                      local_878->ray_space[7].vz.field_0.m128[3] =
                           (float)((uint)bVar14 * iVar51 | (uint)!bVar14 * iVar58);
                      iVar3 = local_870[9];
                      iVar4 = local_870[10];
                      iVar1 = local_870[0xb];
                      iVar48 = local_870[0xc];
                      iVar49 = local_870[0xd];
                      iVar50 = local_870[0xe];
                      iVar51 = local_870[0xf];
                      iVar52 = local_878[1].depth_scale.field_0.i[1];
                      iVar53 = local_878[1].depth_scale.field_0.i[2];
                      iVar54 = local_878[1].depth_scale.field_0.i[3];
                      iVar55 = local_878[1].depth_scale.field_0.i[4];
                      iVar56 = local_878[1].depth_scale.field_0.i[5];
                      iVar57 = local_878[1].depth_scale.field_0.i[6];
                      iVar58 = local_878[1].depth_scale.field_0.i[7];
                      bVar72 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar75 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar75 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar75 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 6) & 1);
                      bVar14 = SUB81(uVar75 >> 7,0);
                      local_878[1].depth_scale.field_0.i[0] =
                           (uint)(bVar65 & 1) * local_870[8] |
                           (uint)!(bool)(bVar65 & 1) * local_878[1].depth_scale.field_0.i[0];
                      local_878[1].depth_scale.field_0.i[1] =
                           (uint)bVar72 * iVar3 | (uint)!bVar72 * iVar52;
                      local_878[1].depth_scale.field_0.i[2] =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * iVar53;
                      local_878[1].depth_scale.field_0.i[3] =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * iVar54;
                      local_878[1].depth_scale.field_0.i[4] =
                           (uint)bVar11 * iVar48 | (uint)!bVar11 * iVar55;
                      local_878[1].depth_scale.field_0.i[5] =
                           (uint)bVar12 * iVar49 | (uint)!bVar12 * iVar56;
                      local_878[1].depth_scale.field_0.i[6] =
                           (uint)bVar13 * iVar50 | (uint)!bVar13 * iVar57;
                      local_878[1].depth_scale.field_0.i[7] =
                           (uint)bVar14 * iVar51 | (uint)!bVar14 * iVar58;
                      iVar3 = local_870[0x11];
                      iVar4 = local_870[0x12];
                      iVar1 = local_870[0x13];
                      iVar48 = local_870[0x14];
                      iVar49 = local_870[0x15];
                      iVar50 = local_870[0x16];
                      iVar51 = local_870[0x17];
                      iVar52 = *(int *)((long)&local_878[1].ray_space[0].vx.field_0 + 4);
                      iVar53 = *(int *)((long)&local_878[1].ray_space[0].vx.field_0 + 8);
                      iVar54 = *(int *)((long)&local_878[1].ray_space[0].vx.field_0 + 0xc);
                      iVar55 = *(int *)&local_878[1].ray_space[0].vy.field_0;
                      iVar56 = *(int *)((long)&local_878[1].ray_space[0].vy.field_0 + 4);
                      iVar57 = *(int *)((long)&local_878[1].ray_space[0].vy.field_0 + 8);
                      iVar58 = *(int *)((long)&local_878[1].ray_space[0].vy.field_0 + 0xc);
                      bVar72 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar75 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar75 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar75 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 6) & 1);
                      bVar14 = SUB81(uVar75 >> 7,0);
                      local_878[1].ray_space[0].vx.field_0.m128[0] =
                           (float)((uint)(bVar65 & 1) * local_870[0x10] |
                                  (uint)!(bool)(bVar65 & 1) *
                                  *(int *)&local_878[1].ray_space[0].vx.field_0);
                      local_878[1].ray_space[0].vx.field_0.m128[1] =
                           (float)((uint)bVar72 * iVar3 | (uint)!bVar72 * iVar52);
                      local_878[1].ray_space[0].vx.field_0.m128[2] =
                           (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar53);
                      local_878[1].ray_space[0].vx.field_0.m128[3] =
                           (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar54);
                      local_878[1].ray_space[0].vy.field_0.m128[0] =
                           (float)((uint)bVar11 * iVar48 | (uint)!bVar11 * iVar55);
                      local_878[1].ray_space[0].vy.field_0.m128[1] =
                           (float)((uint)bVar12 * iVar49 | (uint)!bVar12 * iVar56);
                      local_878[1].ray_space[0].vy.field_0.m128[2] =
                           (float)((uint)bVar13 * iVar50 | (uint)!bVar13 * iVar57);
                      local_878[1].ray_space[0].vy.field_0.m128[3] =
                           (float)((uint)bVar14 * iVar51 | (uint)!bVar14 * iVar58);
                      iVar3 = local_870[0x19];
                      iVar4 = local_870[0x1a];
                      iVar1 = local_870[0x1b];
                      iVar48 = local_870[0x1c];
                      iVar49 = local_870[0x1d];
                      iVar50 = local_870[0x1e];
                      iVar51 = local_870[0x1f];
                      pVVar5 = &local_878[1].ray_space[0].vz;
                      iVar52 = *(int *)((long)&local_878[1].ray_space[0].vz.field_0 + 4);
                      iVar53 = *(int *)((long)&local_878[1].ray_space[0].vz.field_0 + 8);
                      iVar54 = *(int *)((long)&local_878[1].ray_space[0].vz.field_0 + 0xc);
                      iVar55 = *(int *)&local_878[1].ray_space[1].vx.field_0;
                      iVar56 = *(int *)((long)&local_878[1].ray_space[1].vx.field_0 + 4);
                      iVar57 = *(int *)((long)&local_878[1].ray_space[1].vx.field_0 + 8);
                      iVar58 = *(int *)((long)&local_878[1].ray_space[1].vx.field_0 + 0xc);
                      bVar72 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar75 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar75 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar75 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 6) & 1);
                      bVar14 = SUB81(uVar75 >> 7,0);
                      (pVVar5->field_0).m128[0] =
                           (float)((uint)(bVar65 & 1) * local_870[0x18] |
                                  (uint)!(bool)(bVar65 & 1) * *(int *)&pVVar5->field_0);
                      local_878[1].ray_space[0].vz.field_0.m128[1] =
                           (float)((uint)bVar72 * iVar3 | (uint)!bVar72 * iVar52);
                      local_878[1].ray_space[0].vz.field_0.m128[2] =
                           (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar53);
                      local_878[1].ray_space[0].vz.field_0.m128[3] =
                           (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar54);
                      local_878[1].ray_space[1].vx.field_0.m128[0] =
                           (float)((uint)bVar11 * iVar48 | (uint)!bVar11 * iVar55);
                      local_878[1].ray_space[1].vx.field_0.m128[1] =
                           (float)((uint)bVar12 * iVar49 | (uint)!bVar12 * iVar56);
                      local_878[1].ray_space[1].vx.field_0.m128[2] =
                           (float)((uint)bVar13 * iVar50 | (uint)!bVar13 * iVar57);
                      local_878[1].ray_space[1].vx.field_0.m128[3] =
                           (float)((uint)bVar14 * iVar51 | (uint)!bVar14 * iVar58);
                      iVar3 = local_870[0x21];
                      iVar4 = local_870[0x22];
                      iVar1 = local_870[0x23];
                      iVar48 = local_870[0x24];
                      iVar49 = local_870[0x25];
                      iVar50 = local_870[0x26];
                      iVar51 = local_870[0x27];
                      pVVar5 = &local_878[1].ray_space[1].vy;
                      iVar52 = *(int *)((long)&local_878[1].ray_space[1].vy.field_0 + 4);
                      iVar53 = *(int *)((long)&local_878[1].ray_space[1].vy.field_0 + 8);
                      iVar54 = *(int *)((long)&local_878[1].ray_space[1].vy.field_0 + 0xc);
                      iVar55 = *(int *)&local_878[1].ray_space[1].vz.field_0;
                      iVar56 = *(int *)((long)&local_878[1].ray_space[1].vz.field_0 + 4);
                      iVar57 = *(int *)((long)&local_878[1].ray_space[1].vz.field_0 + 8);
                      iVar58 = *(int *)((long)&local_878[1].ray_space[1].vz.field_0 + 0xc);
                      bVar72 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar75 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar75 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar75 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 6) & 1);
                      bVar14 = SUB81(uVar75 >> 7,0);
                      (pVVar5->field_0).m128[0] =
                           (float)((uint)(bVar65 & 1) * local_870[0x20] |
                                  (uint)!(bool)(bVar65 & 1) * *(int *)&pVVar5->field_0);
                      local_878[1].ray_space[1].vy.field_0.m128[1] =
                           (float)((uint)bVar72 * iVar3 | (uint)!bVar72 * iVar52);
                      local_878[1].ray_space[1].vy.field_0.m128[2] =
                           (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar53);
                      local_878[1].ray_space[1].vy.field_0.m128[3] =
                           (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar54);
                      local_878[1].ray_space[1].vz.field_0.m128[0] =
                           (float)((uint)bVar11 * iVar48 | (uint)!bVar11 * iVar55);
                      local_878[1].ray_space[1].vz.field_0.m128[1] =
                           (float)((uint)bVar12 * iVar49 | (uint)!bVar12 * iVar56);
                      local_878[1].ray_space[1].vz.field_0.m128[2] =
                           (float)((uint)bVar13 * iVar50 | (uint)!bVar13 * iVar57);
                      local_878[1].ray_space[1].vz.field_0.m128[3] =
                           (float)((uint)bVar14 * iVar51 | (uint)!bVar14 * iVar58);
                      auVar92 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_870 + 0x28));
                      local_878[1].ray_space[2].vx = (Vector)auVar92._0_16_;
                      local_878[1].ray_space[2].vy = (Vector)auVar92._16_16_;
                      auVar92 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_870 + 0x30));
                      *(undefined1 (*) [32])&local_878[1].ray_space[2].vz = auVar92;
                      auVar92 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_870 + 0x38));
                      local_878[1].ray_space[3].vy = (Vector)auVar92._0_16_;
                      local_878[1].ray_space[3].vz = (Vector)auVar92._16_16_;
                      auVar92 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_870 + 0x40));
                      local_878[1].ray_space[4].vx = (Vector)auVar92._0_16_;
                      local_878[1].ray_space[4].vy = (Vector)auVar92._16_16_;
                      goto LAB_01a0f83a;
                    }
                  }
                  pre->ray_space[4].vz.field_0.m128[(long)ray] = fVar177;
                }
              }
            }
          }
LAB_01a0f83a:
          uVar151 = *(undefined4 *)((long)&pre->ray_space[4].vz.field_0 + (long)ray * 4);
          auVar237._4_4_ = uVar151;
          auVar237._0_4_ = uVar151;
          auVar237._8_4_ = uVar151;
          auVar237._12_4_ = uVar151;
          auVar237._16_4_ = uVar151;
          auVar237._20_4_ = uVar151;
          auVar237._24_4_ = uVar151;
          auVar237._28_4_ = uVar151;
          auVar259 = ZEXT3264(auVar237);
          auVar59._4_4_ = fStack_4dc;
          auVar59._0_4_ = local_4e0;
          auVar59._8_4_ = fStack_4d8;
          auVar59._12_4_ = fStack_4d4;
          auVar59._16_4_ = fStack_4d0;
          auVar59._20_4_ = fStack_4cc;
          auVar59._24_4_ = fStack_4c8;
          auVar59._28_4_ = fStack_4c4;
          uVar17 = vcmpps_avx512vl(auVar237,auVar59,0xd);
          auVar241 = ZEXT3264(CONCAT428(0x7fffffff,
                                        CONCAT424(0x7fffffff,
                                                  CONCAT420(0x7fffffff,
                                                            CONCAT416(0x7fffffff,
                                                                      CONCAT412(0x7fffffff,
                                                                                CONCAT48(0x7fffffff,
                                                                                                                                                                                  
                                                  0x7fffffff7fffffff)))))));
          auVar256 = ZEXT3264(local_740);
          auVar257 = ZEXT3264(local_760);
        }
        auVar161._0_4_ = (float)local_720._0_4_ + (float)local_500._0_4_;
        auVar161._4_4_ = (float)local_720._4_4_ + (float)local_500._4_4_;
        auVar161._8_4_ = fStack_718 + fStack_4f8;
        auVar161._12_4_ = fStack_714 + fStack_4f4;
        auVar161._16_4_ = fStack_710 + fStack_4f0;
        auVar161._20_4_ = fStack_70c + fStack_4ec;
        auVar161._24_4_ = fStack_708 + fStack_4e8;
        auVar161._28_4_ = fStack_704 + fStack_4e4;
        uVar151 = auVar259._0_4_;
        auVar175._4_4_ = uVar151;
        auVar175._0_4_ = uVar151;
        auVar175._8_4_ = uVar151;
        auVar175._12_4_ = uVar151;
        auVar175._16_4_ = uVar151;
        auVar175._20_4_ = uVar151;
        auVar175._24_4_ = uVar151;
        auVar175._28_4_ = uVar151;
        uVar17 = vcmpps_avx512vl(auVar161,auVar175,2);
        auVar162._8_4_ = 2;
        auVar162._0_8_ = 0x200000002;
        auVar162._12_4_ = 2;
        auVar162._16_4_ = 2;
        auVar162._20_4_ = 2;
        auVar162._24_4_ = 2;
        auVar162._28_4_ = 2;
        auVar35._8_4_ = 3;
        auVar35._0_8_ = 0x300000003;
        auVar35._12_4_ = 3;
        auVar35._16_4_ = 3;
        auVar35._20_4_ = 3;
        auVar35._24_4_ = 3;
        auVar35._28_4_ = 3;
        auVar92 = vpblendmd_avx512vl(auVar162,auVar35);
        local_500._0_4_ = (uint)(bVar63 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar63 & 1) * 2;
        bVar72 = (bool)(bVar63 >> 1 & 1);
        local_500._4_4_ = (uint)bVar72 * auVar92._4_4_ | (uint)!bVar72 * 2;
        bVar72 = (bool)(bVar63 >> 2 & 1);
        fStack_4f8 = (float)((uint)bVar72 * auVar92._8_4_ | (uint)!bVar72 * 2);
        bVar72 = (bool)(bVar63 >> 3 & 1);
        fStack_4f4 = (float)((uint)bVar72 * auVar92._12_4_ | (uint)!bVar72 * 2);
        bVar72 = (bool)(bVar63 >> 4 & 1);
        fStack_4f0 = (float)((uint)bVar72 * auVar92._16_4_ | (uint)!bVar72 * 2);
        bVar72 = (bool)(bVar63 >> 5 & 1);
        fStack_4ec = (float)((uint)bVar72 * auVar92._20_4_ | (uint)!bVar72 * 2);
        bVar72 = (bool)(bVar63 >> 6 & 1);
        fStack_4e8 = (float)((uint)bVar72 * auVar92._24_4_ | (uint)!bVar72 * 2);
        fStack_4e4 = (float)((uint)(bVar63 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar63 >> 7) * 2);
        bVar62 = (byte)uVar19 & bVar62 & (byte)uVar17;
        uVar17 = vpcmpd_avx512vl(_local_500,local_480,2);
        local_520 = _local_2e0;
        local_4e0 = (float)local_720._0_4_ + (float)local_2e0._0_4_;
        fStack_4dc = (float)local_720._4_4_ + (float)local_2e0._4_4_;
        fStack_4d8 = fStack_718 + fStack_2d8;
        fStack_4d4 = fStack_714 + fStack_2d4;
        fStack_4d0 = fStack_710 + fStack_2d0;
        fStack_4cc = fStack_70c + fStack_2cc;
        fStack_4c8 = fStack_708 + fStack_2c8;
        fStack_4c4 = fStack_704 + fStack_2c4;
        auVar249 = ZEXT3264(local_800);
        auVar250 = ZEXT3264(local_820);
        auVar246 = ZEXT3264(local_7c0);
        auVar248 = ZEXT3264(local_7e0);
        for (bVar70 = (byte)uVar17 & bVar62; bVar70 != 0;
            bVar70 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar70 & (byte)uVar17) {
          auVar163._8_4_ = 0x7f800000;
          auVar163._0_8_ = 0x7f8000007f800000;
          auVar163._12_4_ = 0x7f800000;
          auVar163._16_4_ = 0x7f800000;
          auVar163._20_4_ = 0x7f800000;
          auVar163._24_4_ = 0x7f800000;
          auVar163._28_4_ = 0x7f800000;
          auVar92 = vblendmps_avx512vl(auVar163,local_520);
          auVar142._0_4_ =
               (uint)(bVar70 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar70 & 1) * 0x7f800000;
          bVar72 = (bool)(bVar70 >> 1 & 1);
          auVar142._4_4_ = (uint)bVar72 * auVar92._4_4_ | (uint)!bVar72 * 0x7f800000;
          bVar72 = (bool)(bVar70 >> 2 & 1);
          auVar142._8_4_ = (uint)bVar72 * auVar92._8_4_ | (uint)!bVar72 * 0x7f800000;
          bVar72 = (bool)(bVar70 >> 3 & 1);
          auVar142._12_4_ = (uint)bVar72 * auVar92._12_4_ | (uint)!bVar72 * 0x7f800000;
          bVar72 = (bool)(bVar70 >> 4 & 1);
          auVar142._16_4_ = (uint)bVar72 * auVar92._16_4_ | (uint)!bVar72 * 0x7f800000;
          bVar72 = (bool)(bVar70 >> 5 & 1);
          auVar142._20_4_ = (uint)bVar72 * auVar92._20_4_ | (uint)!bVar72 * 0x7f800000;
          auVar142._24_4_ =
               (uint)(bVar70 >> 6) * auVar92._24_4_ | (uint)!(bool)(bVar70 >> 6) * 0x7f800000;
          auVar142._28_4_ = 0x7f800000;
          auVar92 = vshufps_avx(auVar142,auVar142,0xb1);
          auVar92 = vminps_avx(auVar142,auVar92);
          auVar93 = vshufpd_avx(auVar92,auVar92,5);
          auVar92 = vminps_avx(auVar92,auVar93);
          auVar93 = vpermpd_avx2(auVar92,0x4e);
          auVar92 = vminps_avx(auVar92,auVar93);
          uVar17 = vcmpps_avx512vl(auVar142,auVar92,0);
          bVar65 = (byte)uVar17 & bVar70;
          bVar63 = bVar70;
          if (bVar65 != 0) {
            bVar63 = bVar65;
          }
          iVar2 = 0;
          for (uVar76 = (uint)bVar63; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
            iVar2 = iVar2 + 1;
          }
          uVar76 = *(uint *)(local_1c0 + (uint)(iVar2 << 2));
          fVar165 = auVar79._0_4_;
          auVar77 = ZEXT416(*(uint *)(local_2c0 + (uint)(iVar2 << 2)));
          if ((float)local_780._0_4_ < 0.0) {
            local_860._0_16_ = ZEXT416(*(uint *)(local_2c0 + (uint)(iVar2 << 2)));
            fVar165 = sqrtf((float)local_780._0_4_);
            auVar248 = ZEXT3264(local_7e0);
            auVar246 = ZEXT3264(local_7c0);
            auVar250 = ZEXT3264(local_820);
            auVar249 = ZEXT3264(local_800);
            auVar77 = local_860._0_16_;
          }
          auVar81 = vminps_avx(local_600._0_16_,local_640._0_16_);
          auVar80 = vmaxps_avx(local_600._0_16_,local_640._0_16_);
          auVar82 = vminps_avx(local_620._0_16_,local_660._0_16_);
          auVar89 = vminps_avx(auVar81,auVar82);
          auVar81 = vmaxps_avx(local_620._0_16_,local_660._0_16_);
          auVar82 = vmaxps_avx(auVar80,auVar81);
          auVar214._8_4_ = 0x7fffffff;
          auVar214._0_8_ = 0x7fffffff7fffffff;
          auVar214._12_4_ = 0x7fffffff;
          auVar80 = vandps_avx(auVar89,auVar214);
          auVar81 = vandps_avx(auVar82,auVar214);
          auVar80 = vmaxps_avx(auVar80,auVar81);
          auVar81 = vmovshdup_avx(auVar80);
          auVar81 = vmaxss_avx(auVar81,auVar80);
          auVar80 = vshufpd_avx(auVar80,auVar80,1);
          auVar80 = vmaxss_avx(auVar80,auVar81);
          fVar177 = auVar80._0_4_ * 1.9073486e-06;
          local_6a0 = vshufps_avx(auVar82,auVar82,0xff);
          auVar77 = vinsertps_avx(auVar77,ZEXT416(uVar76),0x10);
          auVar241 = ZEXT1664(auVar77);
          lVar69 = 5;
          do {
            do {
              bVar72 = lVar69 == 0;
              lVar69 = lVar69 + -1;
              if (bVar72) goto LAB_01a10517;
              fVar186 = auVar241._0_4_;
              auVar155._4_4_ = fVar186;
              auVar155._0_4_ = fVar186;
              auVar155._8_4_ = fVar186;
              auVar155._12_4_ = fVar186;
              auVar80 = vfmadd132ps_fma(auVar155,ZEXT816(0) << 0x40,local_770);
              auVar89 = auVar241._0_16_;
              auVar77 = vmovshdup_avx(auVar89);
              local_580._0_16_ = auVar77;
              fVar206 = 1.0 - auVar77._0_4_;
              auVar77 = vshufps_avx(auVar89,auVar89,0x55);
              fVar179 = auVar77._0_4_;
              auVar195._0_4_ = local_640._0_4_ * fVar179;
              fVar181 = auVar77._4_4_;
              auVar195._4_4_ = local_640._4_4_ * fVar181;
              fVar164 = auVar77._8_4_;
              auVar195._8_4_ = local_640._8_4_ * fVar164;
              fVar183 = auVar77._12_4_;
              auVar195._12_4_ = local_640._12_4_ * fVar183;
              _local_560 = ZEXT416((uint)fVar206);
              auVar215._4_4_ = fVar206;
              auVar215._0_4_ = fVar206;
              auVar215._8_4_ = fVar206;
              auVar215._12_4_ = fVar206;
              auVar77 = vfmadd231ps_fma(auVar195,auVar215,local_600._0_16_);
              auVar227._0_4_ = local_620._0_4_ * fVar179;
              auVar227._4_4_ = local_620._4_4_ * fVar181;
              auVar227._8_4_ = local_620._8_4_ * fVar164;
              auVar227._12_4_ = local_620._12_4_ * fVar183;
              auVar81 = vfmadd231ps_fma(auVar227,auVar215,local_640._0_16_);
              auVar235._0_4_ = fVar179 * (float)local_660._0_4_;
              auVar235._4_4_ = fVar181 * (float)local_660._4_4_;
              auVar235._8_4_ = fVar164 * fStack_658;
              auVar235._12_4_ = fVar183 * fStack_654;
              auVar82 = vfmadd231ps_fma(auVar235,auVar215,local_620._0_16_);
              auVar240._0_4_ = fVar179 * auVar81._0_4_;
              auVar240._4_4_ = fVar181 * auVar81._4_4_;
              auVar240._8_4_ = fVar164 * auVar81._8_4_;
              auVar240._12_4_ = fVar183 * auVar81._12_4_;
              auVar77 = vfmadd231ps_fma(auVar240,auVar215,auVar77);
              auVar196._0_4_ = fVar179 * auVar82._0_4_;
              auVar196._4_4_ = fVar181 * auVar82._4_4_;
              auVar196._8_4_ = fVar164 * auVar82._8_4_;
              auVar196._12_4_ = fVar183 * auVar82._12_4_;
              auVar81 = vfmadd231ps_fma(auVar196,auVar215,auVar81);
              auVar228._0_4_ = fVar179 * auVar81._0_4_;
              auVar228._4_4_ = fVar181 * auVar81._4_4_;
              auVar228._8_4_ = fVar164 * auVar81._8_4_;
              auVar228._12_4_ = fVar183 * auVar81._12_4_;
              auVar82 = vfmadd231ps_fma(auVar228,auVar77,auVar215);
              auVar77 = vsubps_avx(auVar81,auVar77);
              auVar26._8_4_ = 0x40400000;
              auVar26._0_8_ = 0x4040000040400000;
              auVar26._12_4_ = 0x40400000;
              auVar81 = vmulps_avx512vl(auVar77,auVar26);
              local_540._0_16_ = auVar82;
              auVar80 = vsubps_avx(auVar80,auVar82);
              auVar77 = vdpps_avx(auVar80,auVar80,0x7f);
              local_860._0_16_ = auVar77;
              if (auVar77._0_4_ < 0.0) {
                auVar246._0_4_ = sqrtf(auVar77._0_4_);
                auVar246._4_60_ = extraout_var_01;
                auVar77 = auVar246._0_16_;
              }
              else {
                auVar77 = vsqrtss_avx(auVar77,auVar77);
              }
              local_5a0._0_16_ = vdpps_avx(auVar81,auVar81,0x7f);
              fVar179 = local_5a0._0_4_;
              auVar197._4_12_ = ZEXT812(0) << 0x20;
              auVar197._0_4_ = fVar179;
              _local_7a0 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar197);
              fVar181 = local_7a0._0_4_;
              local_5c0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar197);
              auVar27._8_4_ = 0x80000000;
              auVar27._0_8_ = 0x8000000080000000;
              auVar27._12_4_ = 0x80000000;
              auVar78 = vxorps_avx512vl(local_5a0._0_16_,auVar27);
              auVar82 = vfnmadd213ss_fma(local_5c0._0_16_,local_5a0._0_16_,ZEXT416(0x40000000));
              local_5e0._0_4_ = auVar82._0_4_;
              local_700._0_4_ = auVar77._0_4_;
              if (fVar179 < auVar78._0_4_) {
                auVar248._0_4_ = sqrtf(fVar179);
                auVar248._4_60_ = extraout_var_02;
                auVar77 = ZEXT416((uint)local_700._0_4_);
                auVar82 = auVar248._0_16_;
              }
              else {
                auVar82 = vsqrtss_avx512f(local_5a0._0_16_,local_5a0._0_16_);
              }
              fVar164 = local_7a0._0_4_;
              local_7a0._4_4_ = fVar181 * 1.5 + fVar179 * -0.5 * fVar164 * fVar164 * fVar164;
              local_7a0._0_4_ = local_7a0._4_4_;
              fStack_798 = (float)local_7a0._4_4_;
              fStack_794 = (float)local_7a0._4_4_;
              auVar255._0_4_ = auVar81._0_4_ * (float)local_7a0._4_4_;
              auVar255._4_4_ = auVar81._4_4_ * (float)local_7a0._4_4_;
              auVar255._8_4_ = auVar81._8_4_ * (float)local_7a0._4_4_;
              auVar255._12_4_ = auVar81._12_4_ * (float)local_7a0._4_4_;
              auVar78 = vdpps_avx(auVar80,auVar255,0x7f);
              auVar84 = vaddss_avx512f(auVar77,ZEXT416(0x3f800000));
              auVar156._0_4_ = auVar78._0_4_ * auVar78._0_4_;
              auVar156._4_4_ = auVar78._4_4_ * auVar78._4_4_;
              auVar156._8_4_ = auVar78._8_4_ * auVar78._8_4_;
              auVar156._12_4_ = auVar78._12_4_ * auVar78._12_4_;
              auVar88 = vsubps_avx(local_860._0_16_,auVar156);
              fVar179 = auVar88._0_4_;
              auVar170._4_12_ = ZEXT812(0) << 0x20;
              auVar170._0_4_ = fVar179;
              auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar170);
              auVar85 = vmulss_avx512f(auVar83,ZEXT416(0x3fc00000));
              auVar90 = vmulss_avx512f(auVar88,ZEXT416(0xbf000000));
              uVar74 = fVar179 == 0.0;
              uVar73 = fVar179 < 0.0;
              if ((bool)uVar73) {
                local_690 = auVar90._0_4_;
                local_680 = auVar255;
                local_670 = auVar83;
                fVar179 = sqrtf(fVar179);
                auVar90 = ZEXT416((uint)local_690);
                auVar85 = ZEXT416(auVar85._0_4_);
                auVar82 = ZEXT416(auVar82._0_4_);
                auVar77 = ZEXT416((uint)local_700._0_4_);
                auVar84 = ZEXT416(auVar84._0_4_);
                auVar255 = local_680;
                auVar83 = local_670;
              }
              else {
                auVar88 = vsqrtss_avx(auVar88,auVar88);
                fVar179 = auVar88._0_4_;
              }
              auVar249 = ZEXT3264(local_800);
              auVar250 = ZEXT3264(local_820);
              auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_560,local_580._0_16_);
              auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_580._0_16_,_local_560);
              fVar181 = auVar88._0_4_ * 6.0;
              fVar164 = local_580._0_4_ * 6.0;
              auVar216._0_4_ = fVar164 * (float)local_660._0_4_;
              auVar216._4_4_ = fVar164 * (float)local_660._4_4_;
              auVar216._8_4_ = fVar164 * fStack_658;
              auVar216._12_4_ = fVar164 * fStack_654;
              auVar198._4_4_ = fVar181;
              auVar198._0_4_ = fVar181;
              auVar198._8_4_ = fVar181;
              auVar198._12_4_ = fVar181;
              auVar88 = vfmadd132ps_fma(auVar198,auVar216,local_620._0_16_);
              fVar181 = auVar87._0_4_ * 6.0;
              auVar171._4_4_ = fVar181;
              auVar171._0_4_ = fVar181;
              auVar171._8_4_ = fVar181;
              auVar171._12_4_ = fVar181;
              auVar88 = vfmadd132ps_fma(auVar171,auVar88,local_640._0_16_);
              fVar181 = local_560._0_4_ * 6.0;
              auVar199._4_4_ = fVar181;
              auVar199._0_4_ = fVar181;
              auVar199._8_4_ = fVar181;
              auVar199._12_4_ = fVar181;
              auVar88 = vfmadd132ps_fma(auVar199,auVar88,local_600._0_16_);
              auVar172._0_4_ = auVar88._0_4_ * (float)local_5a0._0_4_;
              auVar172._4_4_ = auVar88._4_4_ * (float)local_5a0._0_4_;
              auVar172._8_4_ = auVar88._8_4_ * (float)local_5a0._0_4_;
              auVar172._12_4_ = auVar88._12_4_ * (float)local_5a0._0_4_;
              auVar88 = vdpps_avx(auVar81,auVar88,0x7f);
              fVar181 = auVar88._0_4_;
              auVar200._0_4_ = auVar81._0_4_ * fVar181;
              auVar200._4_4_ = auVar81._4_4_ * fVar181;
              auVar200._8_4_ = auVar81._8_4_ * fVar181;
              auVar200._12_4_ = auVar81._12_4_ * fVar181;
              auVar88 = vsubps_avx(auVar172,auVar200);
              fVar181 = (float)local_5e0._0_4_ * (float)local_5c0._0_4_;
              auVar87 = vmaxss_avx(ZEXT416((uint)fVar177),
                                   ZEXT416((uint)(fVar186 * fVar165 * 1.9073486e-06)));
              auVar28._8_4_ = 0x80000000;
              auVar28._0_8_ = 0x8000000080000000;
              auVar28._12_4_ = 0x80000000;
              auVar86 = vxorps_avx512vl(auVar81,auVar28);
              auVar201._0_4_ = auVar88._0_4_ * fVar181 * (float)local_7a0._0_4_;
              auVar201._4_4_ = auVar88._4_4_ * fVar181 * (float)local_7a0._4_4_;
              auVar201._8_4_ = auVar88._8_4_ * fVar181 * fStack_798;
              auVar201._12_4_ = auVar88._12_4_ * fVar181 * fStack_794;
              auVar88 = vdpps_avx(auVar86,auVar255,0x7f);
              auVar91 = vdivss_avx512f(ZEXT416((uint)fVar177),auVar82);
              auVar82 = vfmadd213ss_fma(auVar77,ZEXT416((uint)fVar177),auVar87);
              auVar77 = vdpps_avx(auVar80,auVar201,0x7f);
              vfmadd213ss_avx512f(auVar84,auVar91,auVar82);
              fVar181 = auVar88._0_4_ + auVar77._0_4_;
              auVar77 = vdpps_avx(local_770,auVar255,0x7f);
              auVar82 = vdpps_avx(auVar80,auVar86,0x7f);
              auVar88 = vmulss_avx512f(auVar90,auVar83);
              auVar83 = vmulss_avx512f(auVar83,auVar83);
              auVar85 = vaddss_avx512f(auVar85,ZEXT416((uint)(auVar88._0_4_ * auVar83._0_4_)));
              auVar88 = vdpps_avx(auVar80,local_770,0x7f);
              auVar84 = vfnmadd231ss_fma(auVar82,auVar78,ZEXT416((uint)fVar181));
              auVar88 = vfnmadd231ss_fma(auVar88,auVar78,auVar77);
              auVar82 = vpermilps_avx(local_540._0_16_,0xff);
              fVar179 = fVar179 - auVar82._0_4_;
              auVar83 = vshufps_avx(auVar81,auVar81,0xff);
              auVar82 = vfmsub213ss_fma(auVar84,auVar85,auVar83);
              auVar243._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
              auVar243._8_4_ = auVar82._8_4_ ^ 0x80000000;
              auVar243._12_4_ = auVar82._12_4_ ^ 0x80000000;
              auVar88 = ZEXT416((uint)(auVar88._0_4_ * auVar85._0_4_));
              auVar84 = vfmsub231ss_fma(ZEXT416((uint)(auVar77._0_4_ * auVar82._0_4_)),
                                        ZEXT416((uint)fVar181),auVar88);
              auVar82 = vinsertps_avx(auVar243,auVar88,0x1c);
              auVar236._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
              auVar236._8_4_ = auVar77._8_4_ ^ 0x80000000;
              auVar236._12_4_ = auVar77._12_4_ ^ 0x80000000;
              auVar88 = vinsertps_avx(ZEXT416((uint)fVar181),auVar236,0x10);
              auVar217._0_4_ = auVar84._0_4_;
              auVar217._4_4_ = auVar217._0_4_;
              auVar217._8_4_ = auVar217._0_4_;
              auVar217._12_4_ = auVar217._0_4_;
              auVar77 = vdivps_avx(auVar82,auVar217);
              auVar82 = vdivps_avx(auVar88,auVar217);
              auVar88 = vbroadcastss_avx512vl(auVar78);
              auVar218._0_4_ = auVar88._0_4_ * auVar77._0_4_ + fVar179 * auVar82._0_4_;
              auVar218._4_4_ = auVar88._4_4_ * auVar77._4_4_ + fVar179 * auVar82._4_4_;
              auVar218._8_4_ = auVar88._8_4_ * auVar77._8_4_ + fVar179 * auVar82._8_4_;
              auVar218._12_4_ = auVar88._12_4_ * auVar77._12_4_ + fVar179 * auVar82._12_4_;
              auVar77 = vsubps_avx(auVar89,auVar218);
              auVar241 = ZEXT1664(auVar77);
              auVar29._8_4_ = 0x7fffffff;
              auVar29._0_8_ = 0x7fffffff7fffffff;
              auVar29._12_4_ = 0x7fffffff;
              auVar82 = vandps_avx512vl(auVar78,auVar29);
              auVar82 = vucomiss_avx512f(auVar82);
              auVar246 = ZEXT3264(local_7c0);
              auVar248 = ZEXT3264(local_7e0);
            } while ((bool)uVar73 || (bool)uVar74);
            auVar82 = vaddss_avx512f(auVar87,auVar82);
            auVar82 = vfmadd231ss_fma(auVar82,local_6a0,ZEXT416(0x36000000));
            auVar30._8_4_ = 0x7fffffff;
            auVar30._0_8_ = 0x7fffffff7fffffff;
            auVar30._12_4_ = 0x7fffffff;
            auVar89 = vandps_avx512vl(ZEXT416((uint)fVar179),auVar30);
          } while (auVar82._0_4_ <= auVar89._0_4_);
          fVar165 = auVar77._0_4_ + (float)local_6b0._0_4_;
          if ((fVar6 <= fVar165) &&
             (fVar177 = pre->ray_space[4].vz.field_0.m128[(long)ray], fVar165 <= fVar177)) {
            auVar82 = vmovshdup_avx(auVar77);
            fVar179 = auVar82._0_4_;
            if ((0.0 <= fVar179) && (fVar179 <= 1.0)) {
              auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_860._0_4_));
              fVar181 = auVar82._0_4_;
              lVar69 = *(long *)(*(long *)(*(long *)k + 0x1e8) + uVar66 * 8);
              if ((*(uint *)(lVar69 + 0x34) & (uint)pre->ray_space[5].vy.field_0.m128[(long)ray]) !=
                  0) {
                fVar181 = fVar181 * 1.5 +
                          (float)local_860._0_4_ * -0.5 * fVar181 * fVar181 * fVar181;
                auVar219._0_4_ = auVar80._0_4_ * fVar181;
                auVar219._4_4_ = auVar80._4_4_ * fVar181;
                auVar219._8_4_ = auVar80._8_4_ * fVar181;
                auVar219._12_4_ = auVar80._12_4_ * fVar181;
                auVar89 = vfmadd213ps_fma(auVar83,auVar219,auVar81);
                auVar80 = vshufps_avx(auVar219,auVar219,0xc9);
                auVar82 = vshufps_avx(auVar81,auVar81,0xc9);
                auVar220._0_4_ = auVar219._0_4_ * auVar82._0_4_;
                auVar220._4_4_ = auVar219._4_4_ * auVar82._4_4_;
                auVar220._8_4_ = auVar219._8_4_ * auVar82._8_4_;
                auVar220._12_4_ = auVar219._12_4_ * auVar82._12_4_;
                auVar82 = vfmsub231ps_fma(auVar220,auVar81,auVar80);
                auVar80 = vshufps_avx(auVar82,auVar82,0xc9);
                auVar81 = vshufps_avx(auVar89,auVar89,0xc9);
                auVar82 = vshufps_avx(auVar82,auVar82,0xd2);
                auVar157._0_4_ = auVar89._0_4_ * auVar82._0_4_;
                auVar157._4_4_ = auVar89._4_4_ * auVar82._4_4_;
                auVar157._8_4_ = auVar89._8_4_ * auVar82._8_4_;
                auVar157._12_4_ = auVar89._12_4_ * auVar82._12_4_;
                auVar80 = vfmsub231ps_fma(auVar157,auVar80,auVar81);
                fVar181 = auVar80._0_4_;
                if ((*(long *)(*(long *)(k + 0x10) + 0x10) == 0) && (*(long *)(lVar69 + 0x40) == 0))
                {
                  pre->ray_space[4].vz.field_0.m128[(long)ray] = fVar165;
                  fVar165 = (float)vextractps_avx(auVar80,1);
                  pre->ray_space[7].vy.field_0.m128[(long)ray] = fVar165;
                  uVar151 = vextractps_avx(auVar80,2);
                  *(undefined4 *)((long)pre[1].ray_space + (long)ray * 4 + -0x20) = uVar151;
                  pre[1].ray_space[0].vx.field_0.m128[(long)ray] = fVar181;
                  pre[1].ray_space[0].vz.field_0.m128[(long)ray] = fVar179;
                  pre[1].ray_space[1].vy.field_0.m128[(long)ray] = 0.0;
                  pre[1].ray_space[2].vx.field_0.m128[(long)ray] = (float)local_828;
                  pre[1].ray_space[2].vz.field_0.m128[(long)ray] = fVar150;
                  pre[1].ray_space[3].vy.field_0.m128[(long)ray] = **(float **)(k + 8);
                  pre[1].ray_space[4].vx.field_0.m128[(long)ray] = *(float *)(*(long *)(k + 8) + 4);
                }
                else {
                  puVar7 = *(undefined4 **)(k + 8);
                  auVar223._8_4_ = 1;
                  auVar223._0_8_ = 0x100000001;
                  auVar223._12_4_ = 1;
                  auVar223._16_4_ = 1;
                  auVar223._20_4_ = 1;
                  auVar223._24_4_ = 1;
                  auVar223._28_4_ = 1;
                  local_3a0 = vpermps_avx2(auVar223,ZEXT1632(auVar77));
                  local_400 = vpermps_avx2(auVar223,ZEXT1632(auVar80));
                  auVar232._8_4_ = 2;
                  auVar232._0_8_ = 0x200000002;
                  auVar232._12_4_ = 2;
                  auVar232._16_4_ = 2;
                  auVar232._20_4_ = 2;
                  auVar232._24_4_ = 2;
                  auVar232._28_4_ = 2;
                  local_3e0 = vpermps_avx2(auVar232,ZEXT1632(auVar80));
                  local_3c0 = fVar181;
                  fStack_3bc = fVar181;
                  fStack_3b8 = fVar181;
                  fStack_3b4 = fVar181;
                  fStack_3b0 = fVar181;
                  fStack_3ac = fVar181;
                  fStack_3a8 = fVar181;
                  fStack_3a4 = fVar181;
                  local_380 = ZEXT432(0) << 0x20;
                  local_360 = local_460._0_8_;
                  uStack_358 = local_460._8_8_;
                  uStack_350 = local_460._16_8_;
                  uStack_348 = local_460._24_8_;
                  local_340 = local_440;
                  auVar92 = vpcmpeqd_avx2(local_440,local_440);
                  local_840[1] = auVar92;
                  *local_840 = auVar92;
                  local_320._0_4_ = *puVar7;
                  local_320._4_4_ = local_320._0_4_;
                  local_320._8_4_ = local_320._0_4_;
                  local_320._12_4_ = local_320._0_4_;
                  local_320._16_4_ = local_320._0_4_;
                  local_320._20_4_ = local_320._0_4_;
                  local_320._24_4_ = local_320._0_4_;
                  local_320._28_4_ = local_320._0_4_;
                  local_300 = puVar7[1];
                  uStack_2fc = local_300;
                  uStack_2f8 = local_300;
                  uStack_2f4 = local_300;
                  uStack_2f0 = local_300;
                  uStack_2ec = local_300;
                  uStack_2e8 = local_300;
                  uStack_2e4 = local_300;
                  pre->ray_space[4].vz.field_0.m128[(long)ray] = fVar165;
                  local_6e0 = local_4a0;
                  local_890 = local_6e0;
                  local_888 = *(undefined8 *)(lVar69 + 0x18);
                  local_880 = *(undefined8 *)(k + 8);
                  local_870 = (int *)local_400;
                  local_868 = 8;
                  local_878 = pre;
                  if (*(code **)(lVar69 + 0x40) != (code *)0x0) {
                    (**(code **)(lVar69 + 0x40))(&local_890);
                    auVar248 = ZEXT3264(local_7e0);
                    auVar246 = ZEXT3264(local_7c0);
                    auVar250 = ZEXT3264(local_820);
                    auVar249 = ZEXT3264(local_800);
                  }
                  if (local_6e0 != (undefined1  [32])0x0) {
                    pcVar8 = *(code **)(*(byte **)(k + 0x10) + 0x10);
                    if ((pcVar8 != (code *)0x0) &&
                       (((**(byte **)(k + 0x10) & 2) != 0 ||
                        ((*(byte *)(lVar69 + 0x3e) & 0x40) != 0)))) {
                      (*pcVar8)(&local_890);
                      auVar248 = ZEXT3264(local_7e0);
                      auVar246 = ZEXT3264(local_7c0);
                      auVar250 = ZEXT3264(local_820);
                      auVar249 = ZEXT3264(local_800);
                    }
                    if (local_6e0 != (undefined1  [32])0x0) {
                      uVar75 = vptestmd_avx512vl(local_6e0,local_6e0);
                      iVar3 = local_870[1];
                      iVar4 = local_870[2];
                      iVar1 = local_870[3];
                      iVar48 = local_870[4];
                      iVar49 = local_870[5];
                      iVar50 = local_870[6];
                      iVar51 = local_870[7];
                      pVVar5 = &local_878->ray_space[7].vy;
                      iVar52 = *(int *)((long)&local_878->ray_space[7].vy.field_0 + 4);
                      iVar53 = *(int *)((long)&local_878->ray_space[7].vy.field_0 + 8);
                      iVar54 = *(int *)((long)&local_878->ray_space[7].vy.field_0 + 0xc);
                      iVar55 = *(int *)&local_878->ray_space[7].vz.field_0;
                      iVar56 = *(int *)((long)&local_878->ray_space[7].vz.field_0 + 4);
                      iVar57 = *(int *)((long)&local_878->ray_space[7].vz.field_0 + 8);
                      iVar58 = *(int *)((long)&local_878->ray_space[7].vz.field_0 + 0xc);
                      bVar63 = (byte)uVar75;
                      bVar72 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar75 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar75 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar75 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 6) & 1);
                      bVar14 = SUB81(uVar75 >> 7,0);
                      (pVVar5->field_0).m128[0] =
                           (float)((uint)(bVar63 & 1) * *local_870 |
                                  (uint)!(bool)(bVar63 & 1) * *(int *)&pVVar5->field_0);
                      local_878->ray_space[7].vy.field_0.m128[1] =
                           (float)((uint)bVar72 * iVar3 | (uint)!bVar72 * iVar52);
                      local_878->ray_space[7].vy.field_0.m128[2] =
                           (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar53);
                      local_878->ray_space[7].vy.field_0.m128[3] =
                           (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar54);
                      local_878->ray_space[7].vz.field_0.m128[0] =
                           (float)((uint)bVar11 * iVar48 | (uint)!bVar11 * iVar55);
                      local_878->ray_space[7].vz.field_0.m128[1] =
                           (float)((uint)bVar12 * iVar49 | (uint)!bVar12 * iVar56);
                      local_878->ray_space[7].vz.field_0.m128[2] =
                           (float)((uint)bVar13 * iVar50 | (uint)!bVar13 * iVar57);
                      local_878->ray_space[7].vz.field_0.m128[3] =
                           (float)((uint)bVar14 * iVar51 | (uint)!bVar14 * iVar58);
                      iVar3 = local_870[9];
                      iVar4 = local_870[10];
                      iVar1 = local_870[0xb];
                      iVar48 = local_870[0xc];
                      iVar49 = local_870[0xd];
                      iVar50 = local_870[0xe];
                      iVar51 = local_870[0xf];
                      iVar52 = local_878[1].depth_scale.field_0.i[1];
                      iVar53 = local_878[1].depth_scale.field_0.i[2];
                      iVar54 = local_878[1].depth_scale.field_0.i[3];
                      iVar55 = local_878[1].depth_scale.field_0.i[4];
                      iVar56 = local_878[1].depth_scale.field_0.i[5];
                      iVar57 = local_878[1].depth_scale.field_0.i[6];
                      iVar58 = local_878[1].depth_scale.field_0.i[7];
                      bVar72 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar75 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar75 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar75 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 6) & 1);
                      bVar14 = SUB81(uVar75 >> 7,0);
                      local_878[1].depth_scale.field_0.i[0] =
                           (uint)(bVar63 & 1) * local_870[8] |
                           (uint)!(bool)(bVar63 & 1) * local_878[1].depth_scale.field_0.i[0];
                      local_878[1].depth_scale.field_0.i[1] =
                           (uint)bVar72 * iVar3 | (uint)!bVar72 * iVar52;
                      local_878[1].depth_scale.field_0.i[2] =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * iVar53;
                      local_878[1].depth_scale.field_0.i[3] =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * iVar54;
                      local_878[1].depth_scale.field_0.i[4] =
                           (uint)bVar11 * iVar48 | (uint)!bVar11 * iVar55;
                      local_878[1].depth_scale.field_0.i[5] =
                           (uint)bVar12 * iVar49 | (uint)!bVar12 * iVar56;
                      local_878[1].depth_scale.field_0.i[6] =
                           (uint)bVar13 * iVar50 | (uint)!bVar13 * iVar57;
                      local_878[1].depth_scale.field_0.i[7] =
                           (uint)bVar14 * iVar51 | (uint)!bVar14 * iVar58;
                      iVar3 = local_870[0x11];
                      iVar4 = local_870[0x12];
                      iVar1 = local_870[0x13];
                      iVar48 = local_870[0x14];
                      iVar49 = local_870[0x15];
                      iVar50 = local_870[0x16];
                      iVar51 = local_870[0x17];
                      iVar52 = *(int *)((long)&local_878[1].ray_space[0].vx.field_0 + 4);
                      iVar53 = *(int *)((long)&local_878[1].ray_space[0].vx.field_0 + 8);
                      iVar54 = *(int *)((long)&local_878[1].ray_space[0].vx.field_0 + 0xc);
                      iVar55 = *(int *)&local_878[1].ray_space[0].vy.field_0;
                      iVar56 = *(int *)((long)&local_878[1].ray_space[0].vy.field_0 + 4);
                      iVar57 = *(int *)((long)&local_878[1].ray_space[0].vy.field_0 + 8);
                      iVar58 = *(int *)((long)&local_878[1].ray_space[0].vy.field_0 + 0xc);
                      bVar72 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar75 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar75 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar75 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 6) & 1);
                      bVar14 = SUB81(uVar75 >> 7,0);
                      local_878[1].ray_space[0].vx.field_0.m128[0] =
                           (float)((uint)(bVar63 & 1) * local_870[0x10] |
                                  (uint)!(bool)(bVar63 & 1) *
                                  *(int *)&local_878[1].ray_space[0].vx.field_0);
                      local_878[1].ray_space[0].vx.field_0.m128[1] =
                           (float)((uint)bVar72 * iVar3 | (uint)!bVar72 * iVar52);
                      local_878[1].ray_space[0].vx.field_0.m128[2] =
                           (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar53);
                      local_878[1].ray_space[0].vx.field_0.m128[3] =
                           (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar54);
                      local_878[1].ray_space[0].vy.field_0.m128[0] =
                           (float)((uint)bVar11 * iVar48 | (uint)!bVar11 * iVar55);
                      local_878[1].ray_space[0].vy.field_0.m128[1] =
                           (float)((uint)bVar12 * iVar49 | (uint)!bVar12 * iVar56);
                      local_878[1].ray_space[0].vy.field_0.m128[2] =
                           (float)((uint)bVar13 * iVar50 | (uint)!bVar13 * iVar57);
                      local_878[1].ray_space[0].vy.field_0.m128[3] =
                           (float)((uint)bVar14 * iVar51 | (uint)!bVar14 * iVar58);
                      iVar3 = local_870[0x19];
                      iVar4 = local_870[0x1a];
                      iVar1 = local_870[0x1b];
                      iVar48 = local_870[0x1c];
                      iVar49 = local_870[0x1d];
                      iVar50 = local_870[0x1e];
                      iVar51 = local_870[0x1f];
                      pVVar5 = &local_878[1].ray_space[0].vz;
                      iVar52 = *(int *)((long)&local_878[1].ray_space[0].vz.field_0 + 4);
                      iVar53 = *(int *)((long)&local_878[1].ray_space[0].vz.field_0 + 8);
                      iVar54 = *(int *)((long)&local_878[1].ray_space[0].vz.field_0 + 0xc);
                      iVar55 = *(int *)&local_878[1].ray_space[1].vx.field_0;
                      iVar56 = *(int *)((long)&local_878[1].ray_space[1].vx.field_0 + 4);
                      iVar57 = *(int *)((long)&local_878[1].ray_space[1].vx.field_0 + 8);
                      iVar58 = *(int *)((long)&local_878[1].ray_space[1].vx.field_0 + 0xc);
                      bVar72 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar75 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar75 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar75 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 6) & 1);
                      bVar14 = SUB81(uVar75 >> 7,0);
                      (pVVar5->field_0).m128[0] =
                           (float)((uint)(bVar63 & 1) * local_870[0x18] |
                                  (uint)!(bool)(bVar63 & 1) * *(int *)&pVVar5->field_0);
                      local_878[1].ray_space[0].vz.field_0.m128[1] =
                           (float)((uint)bVar72 * iVar3 | (uint)!bVar72 * iVar52);
                      local_878[1].ray_space[0].vz.field_0.m128[2] =
                           (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar53);
                      local_878[1].ray_space[0].vz.field_0.m128[3] =
                           (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar54);
                      local_878[1].ray_space[1].vx.field_0.m128[0] =
                           (float)((uint)bVar11 * iVar48 | (uint)!bVar11 * iVar55);
                      local_878[1].ray_space[1].vx.field_0.m128[1] =
                           (float)((uint)bVar12 * iVar49 | (uint)!bVar12 * iVar56);
                      local_878[1].ray_space[1].vx.field_0.m128[2] =
                           (float)((uint)bVar13 * iVar50 | (uint)!bVar13 * iVar57);
                      local_878[1].ray_space[1].vx.field_0.m128[3] =
                           (float)((uint)bVar14 * iVar51 | (uint)!bVar14 * iVar58);
                      iVar3 = local_870[0x21];
                      iVar4 = local_870[0x22];
                      iVar1 = local_870[0x23];
                      iVar48 = local_870[0x24];
                      iVar49 = local_870[0x25];
                      iVar50 = local_870[0x26];
                      iVar51 = local_870[0x27];
                      pVVar5 = &local_878[1].ray_space[1].vy;
                      iVar52 = *(int *)((long)&local_878[1].ray_space[1].vy.field_0 + 4);
                      iVar53 = *(int *)((long)&local_878[1].ray_space[1].vy.field_0 + 8);
                      iVar54 = *(int *)((long)&local_878[1].ray_space[1].vy.field_0 + 0xc);
                      iVar55 = *(int *)&local_878[1].ray_space[1].vz.field_0;
                      iVar56 = *(int *)((long)&local_878[1].ray_space[1].vz.field_0 + 4);
                      iVar57 = *(int *)((long)&local_878[1].ray_space[1].vz.field_0 + 8);
                      iVar58 = *(int *)((long)&local_878[1].ray_space[1].vz.field_0 + 0xc);
                      bVar72 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar75 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar75 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar75 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 6) & 1);
                      bVar14 = SUB81(uVar75 >> 7,0);
                      (pVVar5->field_0).m128[0] =
                           (float)((uint)(bVar63 & 1) * local_870[0x20] |
                                  (uint)!(bool)(bVar63 & 1) * *(int *)&pVVar5->field_0);
                      local_878[1].ray_space[1].vy.field_0.m128[1] =
                           (float)((uint)bVar72 * iVar3 | (uint)!bVar72 * iVar52);
                      local_878[1].ray_space[1].vy.field_0.m128[2] =
                           (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar53);
                      local_878[1].ray_space[1].vy.field_0.m128[3] =
                           (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar54);
                      local_878[1].ray_space[1].vz.field_0.m128[0] =
                           (float)((uint)bVar11 * iVar48 | (uint)!bVar11 * iVar55);
                      local_878[1].ray_space[1].vz.field_0.m128[1] =
                           (float)((uint)bVar12 * iVar49 | (uint)!bVar12 * iVar56);
                      local_878[1].ray_space[1].vz.field_0.m128[2] =
                           (float)((uint)bVar13 * iVar50 | (uint)!bVar13 * iVar57);
                      local_878[1].ray_space[1].vz.field_0.m128[3] =
                           (float)((uint)bVar14 * iVar51 | (uint)!bVar14 * iVar58);
                      auVar92 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_870 + 0x28));
                      local_878[1].ray_space[2].vx = (Vector)auVar92._0_16_;
                      local_878[1].ray_space[2].vy = (Vector)auVar92._16_16_;
                      auVar92 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_870 + 0x30));
                      *(undefined1 (*) [32])&local_878[1].ray_space[2].vz = auVar92;
                      auVar92 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_870 + 0x38));
                      local_878[1].ray_space[3].vy = (Vector)auVar92._0_16_;
                      local_878[1].ray_space[3].vz = (Vector)auVar92._16_16_;
                      auVar92 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_870 + 0x40));
                      local_878[1].ray_space[4].vx = (Vector)auVar92._0_16_;
                      local_878[1].ray_space[4].vy = (Vector)auVar92._16_16_;
                      goto LAB_01a10517;
                    }
                  }
                  pre->ray_space[4].vz.field_0.m128[(long)ray] = fVar177;
                }
              }
            }
          }
LAB_01a10517:
          uVar151 = *(undefined4 *)((long)&pre->ray_space[4].vz.field_0 + (long)ray * 4);
          auVar238._4_4_ = uVar151;
          auVar238._0_4_ = uVar151;
          auVar238._8_4_ = uVar151;
          auVar238._12_4_ = uVar151;
          auVar238._16_4_ = uVar151;
          auVar238._20_4_ = uVar151;
          auVar238._24_4_ = uVar151;
          auVar238._28_4_ = uVar151;
          auVar259 = ZEXT3264(auVar238);
          auVar60._4_4_ = fStack_4dc;
          auVar60._0_4_ = local_4e0;
          auVar60._8_4_ = fStack_4d8;
          auVar60._12_4_ = fStack_4d4;
          auVar60._16_4_ = fStack_4d0;
          auVar60._20_4_ = fStack_4cc;
          auVar60._24_4_ = fStack_4c8;
          auVar60._28_4_ = fStack_4c4;
          uVar17 = vcmpps_avx512vl(auVar238,auVar60,0xd);
          auVar241 = ZEXT3264(CONCAT428(0x7fffffff,
                                        CONCAT424(0x7fffffff,
                                                  CONCAT420(0x7fffffff,
                                                            CONCAT416(0x7fffffff,
                                                                      CONCAT412(0x7fffffff,
                                                                                CONCAT48(0x7fffffff,
                                                                                                                                                                                  
                                                  0x7fffffff7fffffff)))))));
          auVar256 = ZEXT3264(local_740);
          auVar257 = ZEXT3264(local_760);
        }
        uVar20 = vpcmpd_avx512vl(local_480,local_2a0,1);
        uVar19 = vpcmpd_avx512vl(local_480,_local_500,1);
        auVar176._0_4_ = (float)local_720._0_4_ + (float)local_200._0_4_;
        auVar176._4_4_ = (float)local_720._4_4_ + (float)local_200._4_4_;
        auVar176._8_4_ = fStack_718 + fStack_1f8;
        auVar176._12_4_ = fStack_714 + fStack_1f4;
        auVar176._16_4_ = fStack_710 + fStack_1f0;
        auVar176._20_4_ = fStack_70c + fStack_1ec;
        auVar176._24_4_ = fStack_708 + fStack_1e8;
        auVar176._28_4_ = fStack_704 + fStack_1e4;
        uVar151 = auVar259._0_4_;
        auVar205._4_4_ = uVar151;
        auVar205._0_4_ = uVar151;
        auVar205._8_4_ = uVar151;
        auVar205._12_4_ = uVar151;
        auVar205._16_4_ = uVar151;
        auVar205._20_4_ = uVar151;
        auVar205._24_4_ = uVar151;
        auVar205._28_4_ = uVar151;
        uVar17 = vcmpps_avx512vl(auVar176,auVar205,2);
        bVar68 = bVar68 & (byte)uVar20 & (byte)uVar17;
        auVar224._0_4_ = (float)local_720._0_4_ + (float)local_2e0._0_4_;
        auVar224._4_4_ = (float)local_720._4_4_ + (float)local_2e0._4_4_;
        auVar224._8_4_ = fStack_718 + fStack_2d8;
        auVar224._12_4_ = fStack_714 + fStack_2d4;
        auVar224._16_4_ = fStack_710 + fStack_2d0;
        auVar224._20_4_ = fStack_70c + fStack_2cc;
        auVar224._24_4_ = fStack_708 + fStack_2c8;
        auVar224._28_4_ = fStack_704 + fStack_2c4;
        uVar17 = vcmpps_avx512vl(auVar224,auVar205,2);
        bVar62 = bVar62 & (byte)uVar19 & (byte)uVar17 | bVar68;
        if (bVar62 != 0) {
          abStack_180[uVar67 * 0x60] = bVar62;
          bVar72 = (bool)(bVar68 >> 1 & 1);
          bVar9 = (bool)(bVar68 >> 2 & 1);
          bVar10 = (bool)(bVar68 >> 3 & 1);
          bVar11 = (bool)(bVar68 >> 4 & 1);
          bVar12 = (bool)(bVar68 >> 5 & 1);
          auStack_160[uVar67 * 0x18] =
               (uint)(bVar68 & 1) * local_200._0_4_ | (uint)!(bool)(bVar68 & 1) * local_2e0._0_4_;
          auStack_160[uVar67 * 0x18 + 1] =
               (uint)bVar72 * local_200._4_4_ | (uint)!bVar72 * local_2e0._4_4_;
          auStack_160[uVar67 * 0x18 + 2] =
               (uint)bVar9 * (int)fStack_1f8 | (uint)!bVar9 * (int)fStack_2d8;
          auStack_160[uVar67 * 0x18 + 3] =
               (uint)bVar10 * (int)fStack_1f4 | (uint)!bVar10 * (int)fStack_2d4;
          auStack_160[uVar67 * 0x18 + 4] =
               (uint)bVar11 * (int)fStack_1f0 | (uint)!bVar11 * (int)fStack_2d0;
          auStack_160[uVar67 * 0x18 + 5] =
               (uint)bVar12 * (int)fStack_1ec | (uint)!bVar12 * (int)fStack_2cc;
          auStack_160[uVar67 * 0x18 + 6] =
               (uint)(bVar68 >> 6) * (int)fStack_1e8 | (uint)!(bool)(bVar68 >> 6) * (int)fStack_2c8;
          (&fStack_144)[uVar67 * 0x18] = fStack_2c4;
          uVar75 = vmovlps_avx(local_4b0);
          (&uStack_140)[uVar67 * 0xc] = uVar75;
          aiStack_138[uVar67 * 0x18] = iVar71 + 1;
          uVar67 = (ulong)((int)uVar67 + 1);
        }
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar259 = ZEXT3264(auVar92);
        context = local_838;
        fVar165 = (float)local_720._0_4_;
        fVar177 = (float)local_720._4_4_;
        fVar179 = fStack_718;
        fVar181 = fStack_714;
        fVar164 = fStack_710;
        fVar183 = fStack_70c;
        fVar206 = fStack_708;
        fVar186 = fStack_704;
      }
    }
    do {
      uVar76 = (uint)uVar67;
      uVar67 = (ulong)(uVar76 - 1);
      if (uVar76 == 0) {
        uVar151 = *(undefined4 *)((long)&pre->ray_space[4].vz.field_0 + (long)ray * 4);
        auVar37._4_4_ = uVar151;
        auVar37._0_4_ = uVar151;
        auVar37._8_4_ = uVar151;
        auVar37._12_4_ = uVar151;
        auVar37._16_4_ = uVar151;
        auVar37._20_4_ = uVar151;
        auVar37._24_4_ = uVar151;
        auVar37._28_4_ = uVar151;
        uVar17 = vcmpps_avx512vl(local_280,auVar37,2);
        local_830 = (ulong)((uint)uVar17 & (uint)local_830 - 1 & (uint)local_830);
        goto LAB_01a0dfbf;
      }
      auVar92 = *(undefined1 (*) [32])(auStack_160 + uVar67 * 0x18);
      auVar173._0_4_ = fVar165 + auVar92._0_4_;
      auVar173._4_4_ = fVar177 + auVar92._4_4_;
      auVar173._8_4_ = fVar179 + auVar92._8_4_;
      auVar173._12_4_ = fVar181 + auVar92._12_4_;
      auVar173._16_4_ = fVar164 + auVar92._16_4_;
      auVar173._20_4_ = fVar183 + auVar92._20_4_;
      auVar173._24_4_ = fVar206 + auVar92._24_4_;
      auVar173._28_4_ = fVar186 + auVar92._28_4_;
      uVar151 = *(undefined4 *)((long)&pre->ray_space[4].vz.field_0 + (long)ray * 4);
      auVar36._4_4_ = uVar151;
      auVar36._0_4_ = uVar151;
      auVar36._8_4_ = uVar151;
      auVar36._12_4_ = uVar151;
      auVar36._16_4_ = uVar151;
      auVar36._20_4_ = uVar151;
      auVar36._24_4_ = uVar151;
      auVar36._28_4_ = uVar151;
      uVar17 = vcmpps_avx512vl(auVar173,auVar36,2);
      uVar143 = (uint)uVar17 & (uint)abStack_180[uVar67 * 0x60];
    } while (uVar143 == 0);
    uVar75 = (&uStack_140)[uVar67 * 0xc];
    auVar91._8_8_ = 0;
    auVar91._0_8_ = uVar75;
    auVar204._8_4_ = 0x7f800000;
    auVar204._0_8_ = 0x7f8000007f800000;
    auVar204._12_4_ = 0x7f800000;
    auVar204._16_4_ = 0x7f800000;
    auVar204._20_4_ = 0x7f800000;
    auVar204._24_4_ = 0x7f800000;
    auVar204._28_4_ = 0x7f800000;
    auVar93 = vblendmps_avx512vl(auVar204,auVar92);
    bVar62 = (byte)uVar143;
    auVar140._0_4_ =
         (uint)(bVar62 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar62 & 1) * (int)auVar92._0_4_;
    bVar72 = (bool)((byte)(uVar143 >> 1) & 1);
    auVar140._4_4_ = (uint)bVar72 * auVar93._4_4_ | (uint)!bVar72 * (int)auVar92._4_4_;
    bVar72 = (bool)((byte)(uVar143 >> 2) & 1);
    auVar140._8_4_ = (uint)bVar72 * auVar93._8_4_ | (uint)!bVar72 * (int)auVar92._8_4_;
    bVar72 = (bool)((byte)(uVar143 >> 3) & 1);
    auVar140._12_4_ = (uint)bVar72 * auVar93._12_4_ | (uint)!bVar72 * (int)auVar92._12_4_;
    bVar72 = (bool)((byte)(uVar143 >> 4) & 1);
    auVar140._16_4_ = (uint)bVar72 * auVar93._16_4_ | (uint)!bVar72 * (int)auVar92._16_4_;
    bVar72 = (bool)((byte)(uVar143 >> 5) & 1);
    auVar140._20_4_ = (uint)bVar72 * auVar93._20_4_ | (uint)!bVar72 * (int)auVar92._20_4_;
    bVar72 = (bool)((byte)(uVar143 >> 6) & 1);
    auVar140._24_4_ = (uint)bVar72 * auVar93._24_4_ | (uint)!bVar72 * (int)auVar92._24_4_;
    auVar140._28_4_ =
         (uVar143 >> 7) * auVar93._28_4_ | (uint)!SUB41(uVar143 >> 7,0) * (int)auVar92._28_4_;
    auVar92 = vshufps_avx(auVar140,auVar140,0xb1);
    auVar92 = vminps_avx(auVar140,auVar92);
    auVar93 = vshufpd_avx(auVar92,auVar92,5);
    auVar92 = vminps_avx(auVar92,auVar93);
    auVar93 = vpermpd_avx2(auVar92,0x4e);
    auVar92 = vminps_avx(auVar92,auVar93);
    uVar17 = vcmpps_avx512vl(auVar140,auVar92,0);
    bVar70 = (byte)uVar17 & bVar62;
    if (bVar70 != 0) {
      uVar143 = (uint)bVar70;
    }
    uVar144 = 0;
    for (; (uVar143 & 1) == 0; uVar143 = uVar143 >> 1 | 0x80000000) {
      uVar144 = uVar144 + 1;
    }
    iVar71 = aiStack_138[uVar67 * 0x18];
    bVar62 = ~('\x01' << ((byte)uVar144 & 0x1f)) & bVar62;
    abStack_180[uVar67 * 0x60] = bVar62;
    if (bVar62 == 0) {
      uVar76 = uVar76 - 1;
    }
    uVar151 = (undefined4)uVar75;
    auVar158._4_4_ = uVar151;
    auVar158._0_4_ = uVar151;
    auVar158._8_4_ = uVar151;
    auVar158._12_4_ = uVar151;
    auVar158._16_4_ = uVar151;
    auVar158._20_4_ = uVar151;
    auVar158._24_4_ = uVar151;
    auVar158._28_4_ = uVar151;
    auVar77 = vmovshdup_avx(auVar91);
    auVar77 = vsubps_avx(auVar77,auVar91);
    auVar174._0_4_ = auVar77._0_4_;
    auVar174._4_4_ = auVar174._0_4_;
    auVar174._8_4_ = auVar174._0_4_;
    auVar174._12_4_ = auVar174._0_4_;
    auVar174._16_4_ = auVar174._0_4_;
    auVar174._20_4_ = auVar174._0_4_;
    auVar174._24_4_ = auVar174._0_4_;
    auVar174._28_4_ = auVar174._0_4_;
    auVar77 = vfmadd132ps_fma(auVar174,auVar158,_DAT_01f7b040);
    local_400 = ZEXT1632(auVar77);
    local_4b0._8_8_ = 0;
    local_4b0._0_8_ = *(ulong *)(local_400 + (ulong)uVar144 * 4);
    uVar67 = (ulong)uVar76;
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }